

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar55;
  byte bVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  uint uVar63;
  bool bVar64;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar67 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar115;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar90;
  float fVar91;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar94 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float t1;
  float fVar142;
  float fVar151;
  float fVar152;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  vint4 bi;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar190;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar173 [16];
  float fVar192;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar208;
  float fVar209;
  undefined1 auVar194 [16];
  float fVar210;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [64];
  vfloat4 b0;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  vint4 ai_1;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  float fVar246;
  float fVar247;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar244 [32];
  float fVar248;
  undefined1 auVar245 [32];
  float fVar252;
  float fVar258;
  float fVar259;
  __m128 a;
  float fVar260;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar261;
  float fVar270;
  float fVar271;
  vfloat4 a0_1;
  float fVar272;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  float fVar273;
  float fVar277;
  float fVar278;
  undefined1 auVar274 [16];
  float fVar279;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar290;
  float fVar291;
  undefined1 auVar285 [16];
  float fVar292;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar293;
  undefined1 auVar289 [64];
  float fVar294;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar303;
  vfloat4 a0;
  undefined1 auVar302 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint auStack_4a0 [4];
  RTCFilterFunctionNArguments local_490;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar206 [32];
  undefined1 auVar298 [32];
  
  PVar8 = prim[1];
  uVar62 = (ulong)(byte)PVar8;
  auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar138 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar198 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar172 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar138 = vsubps_avx(auVar138,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar116._0_4_ = fVar172 * auVar138._0_4_;
  auVar116._4_4_ = fVar172 * auVar138._4_4_;
  auVar116._8_4_ = fVar172 * auVar138._8_4_;
  auVar116._12_4_ = fVar172 * auVar138._12_4_;
  auVar211._0_4_ = fVar172 * auVar198._0_4_;
  auVar211._4_4_ = fVar172 * auVar198._4_4_;
  auVar211._8_4_ = fVar172 * auVar198._8_4_;
  auVar211._12_4_ = fVar172 * auVar198._12_4_;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar62 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar59 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + uVar62 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar59 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar65 = vshufps_avx(auVar211,auVar211,0);
  auVar92 = vshufps_avx(auVar211,auVar211,0x55);
  auVar117 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar172 = auVar117._0_4_;
  fVar142 = auVar117._4_4_;
  fVar190 = auVar117._8_4_;
  fVar151 = auVar117._12_4_;
  fVar193 = auVar92._0_4_;
  fVar208 = auVar92._4_4_;
  fVar209 = auVar92._8_4_;
  fVar210 = auVar92._12_4_;
  fVar191 = auVar65._0_4_;
  fVar152 = auVar65._4_4_;
  fVar192 = auVar65._8_4_;
  fVar153 = auVar65._12_4_;
  auVar274._0_4_ = fVar191 * auVar138._0_4_ + fVar193 * auVar198._0_4_ + fVar172 * auVar136._0_4_;
  auVar274._4_4_ = fVar152 * auVar138._4_4_ + fVar208 * auVar198._4_4_ + fVar142 * auVar136._4_4_;
  auVar274._8_4_ = fVar192 * auVar138._8_4_ + fVar209 * auVar198._8_4_ + fVar190 * auVar136._8_4_;
  auVar274._12_4_ =
       fVar153 * auVar138._12_4_ + fVar210 * auVar198._12_4_ + fVar151 * auVar136._12_4_;
  auVar285._0_4_ = fVar191 * auVar15._0_4_ + fVar193 * auVar264._0_4_ + auVar16._0_4_ * fVar172;
  auVar285._4_4_ = fVar152 * auVar15._4_4_ + fVar208 * auVar264._4_4_ + auVar16._4_4_ * fVar142;
  auVar285._8_4_ = fVar192 * auVar15._8_4_ + fVar209 * auVar264._8_4_ + auVar16._8_4_ * fVar190;
  auVar285._12_4_ = fVar153 * auVar15._12_4_ + fVar210 * auVar264._12_4_ + auVar16._12_4_ * fVar151;
  auVar212._0_4_ = fVar191 * auVar66._0_4_ + fVar193 * auVar96._0_4_ + auVar126._0_4_ * fVar172;
  auVar212._4_4_ = fVar152 * auVar66._4_4_ + fVar208 * auVar96._4_4_ + auVar126._4_4_ * fVar142;
  auVar212._8_4_ = fVar192 * auVar66._8_4_ + fVar209 * auVar96._8_4_ + auVar126._8_4_ * fVar190;
  auVar212._12_4_ = fVar153 * auVar66._12_4_ + fVar210 * auVar96._12_4_ + auVar126._12_4_ * fVar151;
  auVar65 = vshufps_avx(auVar116,auVar116,0);
  auVar92 = vshufps_avx(auVar116,auVar116,0x55);
  auVar117 = vshufps_avx(auVar116,auVar116,0xaa);
  fVar172 = auVar117._0_4_;
  fVar142 = auVar117._4_4_;
  fVar190 = auVar117._8_4_;
  fVar151 = auVar117._12_4_;
  fVar193 = auVar92._0_4_;
  fVar208 = auVar92._4_4_;
  fVar209 = auVar92._8_4_;
  fVar210 = auVar92._12_4_;
  fVar191 = auVar65._0_4_;
  fVar152 = auVar65._4_4_;
  fVar192 = auVar65._8_4_;
  fVar153 = auVar65._12_4_;
  auVar154._0_4_ = fVar191 * auVar138._0_4_ + fVar193 * auVar198._0_4_ + fVar172 * auVar136._0_4_;
  auVar154._4_4_ = fVar152 * auVar138._4_4_ + fVar208 * auVar198._4_4_ + fVar142 * auVar136._4_4_;
  auVar154._8_4_ = fVar192 * auVar138._8_4_ + fVar209 * auVar198._8_4_ + fVar190 * auVar136._8_4_;
  auVar154._12_4_ =
       fVar153 * auVar138._12_4_ + fVar210 * auVar198._12_4_ + fVar151 * auVar136._12_4_;
  auVar92._0_4_ = fVar191 * auVar15._0_4_ + auVar16._0_4_ * fVar172 + fVar193 * auVar264._0_4_;
  auVar92._4_4_ = fVar152 * auVar15._4_4_ + auVar16._4_4_ * fVar142 + fVar208 * auVar264._4_4_;
  auVar92._8_4_ = fVar192 * auVar15._8_4_ + auVar16._8_4_ * fVar190 + fVar209 * auVar264._8_4_;
  auVar92._12_4_ = fVar153 * auVar15._12_4_ + auVar16._12_4_ * fVar151 + fVar210 * auVar264._12_4_;
  auVar65._0_4_ = fVar191 * auVar66._0_4_ + fVar193 * auVar96._0_4_ + auVar126._0_4_ * fVar172;
  auVar65._4_4_ = fVar152 * auVar66._4_4_ + fVar208 * auVar96._4_4_ + auVar126._4_4_ * fVar142;
  auVar65._8_4_ = fVar192 * auVar66._8_4_ + fVar209 * auVar96._8_4_ + auVar126._8_4_ * fVar190;
  auVar65._12_4_ = fVar153 * auVar66._12_4_ + fVar210 * auVar96._12_4_ + auVar126._12_4_ * fVar151;
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar138 = vandps_avx(auVar274,auVar194);
  auVar143._8_4_ = 0x219392ef;
  auVar143._0_8_ = 0x219392ef219392ef;
  auVar143._12_4_ = 0x219392ef;
  auVar138 = vcmpps_avx(auVar138,auVar143,1);
  auVar198 = vblendvps_avx(auVar274,auVar143,auVar138);
  auVar138 = vandps_avx(auVar285,auVar194);
  auVar138 = vcmpps_avx(auVar138,auVar143,1);
  auVar136 = vblendvps_avx(auVar285,auVar143,auVar138);
  auVar138 = vandps_avx(auVar212,auVar194);
  auVar138 = vcmpps_avx(auVar138,auVar143,1);
  auVar138 = vblendvps_avx(auVar212,auVar143,auVar138);
  auVar15 = vrcpps_avx(auVar198);
  fVar193 = auVar15._0_4_;
  auVar117._0_4_ = fVar193 * auVar198._0_4_;
  fVar208 = auVar15._4_4_;
  auVar117._4_4_ = fVar208 * auVar198._4_4_;
  fVar209 = auVar15._8_4_;
  auVar117._8_4_ = fVar209 * auVar198._8_4_;
  fVar210 = auVar15._12_4_;
  auVar117._12_4_ = fVar210 * auVar198._12_4_;
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = 0x3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar198 = vsubps_avx(auVar213,auVar117);
  fVar193 = fVar193 + fVar193 * auVar198._0_4_;
  fVar208 = fVar208 + fVar208 * auVar198._4_4_;
  fVar209 = fVar209 + fVar209 * auVar198._8_4_;
  fVar210 = fVar210 + fVar210 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar136);
  fVar172 = auVar198._0_4_;
  auVar173._0_4_ = fVar172 * auVar136._0_4_;
  fVar190 = auVar198._4_4_;
  auVar173._4_4_ = fVar190 * auVar136._4_4_;
  fVar191 = auVar198._8_4_;
  auVar173._8_4_ = fVar191 * auVar136._8_4_;
  fVar192 = auVar198._12_4_;
  auVar173._12_4_ = fVar192 * auVar136._12_4_;
  auVar198 = vsubps_avx(auVar213,auVar173);
  fVar172 = fVar172 + fVar172 * auVar198._0_4_;
  fVar190 = fVar190 + fVar190 * auVar198._4_4_;
  fVar191 = fVar191 + fVar191 * auVar198._8_4_;
  fVar192 = fVar192 + fVar192 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar138);
  fVar142 = auVar198._0_4_;
  auVar144._0_4_ = fVar142 * auVar138._0_4_;
  fVar151 = auVar198._4_4_;
  auVar144._4_4_ = fVar151 * auVar138._4_4_;
  fVar152 = auVar198._8_4_;
  auVar144._8_4_ = fVar152 * auVar138._8_4_;
  fVar153 = auVar198._12_4_;
  auVar144._12_4_ = fVar153 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar213,auVar144);
  fVar142 = fVar142 + fVar142 * auVar138._0_4_;
  fVar151 = fVar151 + fVar151 * auVar138._4_4_;
  fVar152 = fVar152 + fVar152 * auVar138._8_4_;
  fVar153 = fVar153 + fVar153 * auVar138._12_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar138 = vpmovsxwd_avx(auVar138);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar154);
  auVar118._0_4_ = fVar193 * auVar138._0_4_;
  auVar118._4_4_ = fVar208 * auVar138._4_4_;
  auVar118._8_4_ = fVar209 * auVar138._8_4_;
  auVar118._12_4_ = fVar210 * auVar138._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar138 = vpmovsxwd_avx(auVar198);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar154);
  auVar155._0_4_ = fVar193 * auVar138._0_4_;
  auVar155._4_4_ = fVar208 * auVar138._4_4_;
  auVar155._8_4_ = fVar209 * auVar138._8_4_;
  auVar155._12_4_ = fVar210 * auVar138._12_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar198 = vpmovsxwd_avx(auVar136);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar62 * -2 + 6);
  auVar138 = vpmovsxwd_avx(auVar15);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar92);
  auVar222._0_4_ = auVar138._0_4_ * fVar172;
  auVar222._4_4_ = auVar138._4_4_ * fVar190;
  auVar222._8_4_ = auVar138._8_4_ * fVar191;
  auVar222._12_4_ = auVar138._12_4_ * fVar192;
  auVar138 = vcvtdq2ps_avx(auVar198);
  auVar138 = vsubps_avx(auVar138,auVar92);
  auVar126._0_4_ = fVar172 * auVar138._0_4_;
  auVar126._4_4_ = fVar190 * auVar138._4_4_;
  auVar126._8_4_ = fVar191 * auVar138._8_4_;
  auVar126._12_4_ = fVar192 * auVar138._12_4_;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar59 + uVar62 + 6);
  auVar138 = vpmovsxwd_avx(auVar264);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar65);
  auVar174._0_4_ = auVar138._0_4_ * fVar142;
  auVar174._4_4_ = auVar138._4_4_ * fVar151;
  auVar174._8_4_ = auVar138._8_4_ * fVar152;
  auVar174._12_4_ = auVar138._12_4_ * fVar153;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar138 = vpmovsxwd_avx(auVar16);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar138 = vsubps_avx(auVar138,auVar65);
  auVar66._0_4_ = auVar138._0_4_ * fVar142;
  auVar66._4_4_ = auVar138._4_4_ * fVar151;
  auVar66._8_4_ = auVar138._8_4_ * fVar152;
  auVar66._12_4_ = auVar138._12_4_ * fVar153;
  auVar138 = vpminsd_avx(auVar118,auVar155);
  auVar198 = vpminsd_avx(auVar222,auVar126);
  auVar138 = vmaxps_avx(auVar138,auVar198);
  auVar198 = vpminsd_avx(auVar174,auVar66);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar232._4_4_ = uVar6;
  auVar232._0_4_ = uVar6;
  auVar232._8_4_ = uVar6;
  auVar232._12_4_ = uVar6;
  auVar198 = vmaxps_avx(auVar198,auVar232);
  auVar138 = vmaxps_avx(auVar138,auVar198);
  local_410._0_4_ = auVar138._0_4_ * 0.99999964;
  local_410._4_4_ = auVar138._4_4_ * 0.99999964;
  local_410._8_4_ = auVar138._8_4_ * 0.99999964;
  local_410._12_4_ = auVar138._12_4_ * 0.99999964;
  auVar138 = vpmaxsd_avx(auVar118,auVar155);
  auVar198 = vpmaxsd_avx(auVar222,auVar126);
  auVar138 = vminps_avx(auVar138,auVar198);
  auVar198 = vpmaxsd_avx(auVar174,auVar66);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar119._4_4_ = uVar6;
  auVar119._0_4_ = uVar6;
  auVar119._8_4_ = uVar6;
  auVar119._12_4_ = uVar6;
  auVar198 = vminps_avx(auVar198,auVar119);
  auVar138 = vminps_avx(auVar138,auVar198);
  auVar96._0_4_ = auVar138._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar138._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar138._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar138._12_4_ * 1.0000004;
  auVar138 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar198 = vpcmpgtd_avx(auVar138,_DAT_01f7fcf0);
  auVar138 = vcmpps_avx(local_410,auVar96,2);
  auVar138 = vandps_avx(auVar138,auVar198);
  uVar55 = vmovmskps_avx(auVar138);
  if (uVar55 == 0) {
    return false;
  }
  uVar55 = uVar55 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  uVar60 = 1 << ((byte)k & 0x1f);
  local_2c0 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
LAB_00e118a0:
  uVar59 = (ulong)uVar55;
  lVar58 = 0;
  if (uVar59 != 0) {
    for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
    }
  }
  uVar55 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar55].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar58 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar62 * (long)pvVar11);
  fVar172 = *pfVar1;
  fVar142 = pfVar1[1];
  fVar190 = pfVar1[2];
  fVar151 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar62 + 1) * (long)pvVar11);
  pfVar2 = (float *)(_Var12 + (uVar62 + 2) * (long)pvVar11);
  pfVar3 = (float *)(_Var12 + (long)pvVar11 * (uVar62 + 3));
  fVar191 = *pfVar3;
  fVar152 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar153 = pfVar3[3];
  uVar59 = uVar59 - 1 & uVar59;
  lVar13 = *(long *)&pGVar9[1].time_range.upper;
  pfVar3 = (float *)(lVar13 + (long)p_Var10 * uVar62);
  fVar193 = *pfVar3;
  fVar208 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar13 + (long)p_Var10 * (uVar62 + 1));
  pfVar4 = (float *)(lVar13 + (long)p_Var10 * (uVar62 + 2));
  lVar14 = 0;
  if (uVar59 != 0) {
    for (; (uVar59 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar5 = (float *)(lVar13 + (long)p_Var10 * (uVar62 + 3));
  fVar89 = *pfVar5;
  fVar90 = pfVar5[1];
  fVar91 = pfVar5[2];
  fVar115 = pfVar5[3];
  if (((uVar59 != 0) && (uVar62 = uVar59 - 1 & uVar59, uVar62 != 0)) && (lVar13 = 0, uVar62 != 0)) {
    for (; (uVar62 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar136 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar252 = *pfVar4 * 0.0;
  fVar258 = pfVar4[1] * 0.0;
  fVar259 = pfVar4[2] * 0.0;
  fVar260 = pfVar4[3] * 0.0;
  fVar261 = fVar252 + fVar89 * 0.0;
  fVar270 = fVar258 + fVar90 * 0.0;
  fVar271 = fVar259 + fVar91 * 0.0;
  fVar272 = fVar260 + fVar115 * 0.0;
  fVar273 = *pfVar3 * 0.0;
  fVar277 = pfVar3[1] * 0.0;
  fVar278 = pfVar3[2] * 0.0;
  fVar279 = pfVar3[3] * 0.0;
  local_6a0._0_4_ = fVar193 + fVar273 + fVar261;
  local_6a0._4_4_ = fVar208 + fVar277 + fVar270;
  fStack_698 = fVar209 + fVar278 + fVar271;
  fStack_694 = fVar210 + fVar279 + fVar272;
  auVar120._0_4_ = fVar261 + *pfVar3 * 3.0;
  auVar120._4_4_ = fVar270 + pfVar3[1] * 3.0;
  auVar120._8_4_ = fVar271 + pfVar3[2] * 3.0;
  auVar120._12_4_ = fVar272 + pfVar3[3] * 3.0;
  auVar262._0_4_ = fVar193 * 3.0;
  auVar262._4_4_ = fVar208 * 3.0;
  auVar262._8_4_ = fVar209 * 3.0;
  auVar262._12_4_ = fVar210 * 3.0;
  auVar126 = vsubps_avx(auVar120,auVar262);
  fVar284 = *pfVar2 * 0.0;
  fVar290 = pfVar2[1] * 0.0;
  fVar291 = pfVar2[2] * 0.0;
  fVar292 = pfVar2[3] * 0.0;
  fVar261 = fVar284 + fVar191 * 0.0;
  fVar270 = fVar290 + fVar152 * 0.0;
  fVar271 = fVar291 + fVar192 * 0.0;
  fVar272 = fVar292 + fVar153 * 0.0;
  fVar294 = *pfVar1 * 0.0;
  fVar299 = pfVar1[1] * 0.0;
  fVar300 = pfVar1[2] * 0.0;
  fVar301 = pfVar1[3] * 0.0;
  auVar302._0_4_ = fVar294 + fVar261 + fVar172;
  auVar302._4_4_ = fVar299 + fVar270 + fVar142;
  auVar302._8_4_ = fVar300 + fVar271 + fVar190;
  auVar302._12_4_ = fVar301 + fVar272 + fVar151;
  auVar145._0_4_ = fVar261 + *pfVar1 * 3.0;
  auVar145._4_4_ = fVar270 + pfVar1[1] * 3.0;
  auVar145._8_4_ = fVar271 + pfVar1[2] * 3.0;
  auVar145._12_4_ = fVar272 + pfVar1[3] * 3.0;
  auVar263._0_4_ = fVar172 * 3.0;
  auVar263._4_4_ = fVar142 * 3.0;
  auVar263._8_4_ = fVar190 * 3.0;
  auVar263._12_4_ = fVar151 * 3.0;
  auVar264 = vsubps_avx(auVar145,auVar263);
  auVar223._0_4_ = fVar193 * 0.0;
  auVar223._4_4_ = fVar208 * 0.0;
  auVar223._8_4_ = fVar209 * 0.0;
  auVar223._12_4_ = fVar210 * 0.0;
  auVar146._0_4_ = auVar223._0_4_ + fVar273 + fVar252 + fVar89;
  auVar146._4_4_ = auVar223._4_4_ + fVar277 + fVar258 + fVar90;
  auVar146._8_4_ = auVar223._8_4_ + fVar278 + fVar259 + fVar91;
  auVar146._12_4_ = auVar223._12_4_ + fVar279 + fVar260 + fVar115;
  auVar233._0_4_ = fVar89 * 3.0;
  auVar233._4_4_ = fVar90 * 3.0;
  auVar233._8_4_ = fVar91 * 3.0;
  auVar233._12_4_ = fVar115 * 3.0;
  auVar156._0_4_ = *pfVar4 * 3.0;
  auVar156._4_4_ = pfVar4[1] * 3.0;
  auVar156._8_4_ = pfVar4[2] * 3.0;
  auVar156._12_4_ = pfVar4[3] * 3.0;
  auVar138 = vsubps_avx(auVar233,auVar156);
  auVar157._0_4_ = fVar273 + auVar138._0_4_;
  auVar157._4_4_ = fVar277 + auVar138._4_4_;
  auVar157._8_4_ = fVar278 + auVar138._8_4_;
  auVar157._12_4_ = fVar279 + auVar138._12_4_;
  auVar65 = vsubps_avx(auVar157,auVar223);
  auVar175._0_4_ = fVar172 * 0.0;
  auVar175._4_4_ = fVar142 * 0.0;
  auVar175._8_4_ = fVar190 * 0.0;
  auVar175._12_4_ = fVar151 * 0.0;
  auVar234._0_4_ = fVar294 + fVar284 + fVar191 + auVar175._0_4_;
  auVar234._4_4_ = fVar299 + fVar290 + fVar152 + auVar175._4_4_;
  auVar234._8_4_ = fVar300 + fVar291 + fVar192 + auVar175._8_4_;
  auVar234._12_4_ = fVar301 + fVar292 + fVar153 + auVar175._12_4_;
  auVar214._0_4_ = fVar191 * 3.0;
  auVar214._4_4_ = fVar152 * 3.0;
  auVar214._8_4_ = fVar192 * 3.0;
  auVar214._12_4_ = fVar153 * 3.0;
  auVar195._0_4_ = *pfVar2 * 3.0;
  auVar195._4_4_ = pfVar2[1] * 3.0;
  auVar195._8_4_ = pfVar2[2] * 3.0;
  auVar195._12_4_ = pfVar2[3] * 3.0;
  auVar138 = vsubps_avx(auVar214,auVar195);
  auVar196._0_4_ = fVar294 + auVar138._0_4_;
  auVar196._4_4_ = fVar299 + auVar138._4_4_;
  auVar196._8_4_ = fVar300 + auVar138._8_4_;
  auVar196._12_4_ = fVar301 + auVar138._12_4_;
  auVar66 = vsubps_avx(auVar196,auVar175);
  auVar138 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar198 = vshufps_avx(auVar302,auVar302,0xc9);
  fVar259 = auVar126._0_4_;
  auVar215._0_4_ = fVar259 * auVar198._0_4_;
  fVar260 = auVar126._4_4_;
  auVar215._4_4_ = fVar260 * auVar198._4_4_;
  fVar261 = auVar126._8_4_;
  auVar215._8_4_ = fVar261 * auVar198._8_4_;
  fVar270 = auVar126._12_4_;
  auVar215._12_4_ = fVar270 * auVar198._12_4_;
  auVar224._0_4_ = auVar302._0_4_ * auVar138._0_4_;
  auVar224._4_4_ = auVar302._4_4_ * auVar138._4_4_;
  auVar224._8_4_ = auVar302._8_4_ * auVar138._8_4_;
  auVar224._12_4_ = auVar302._12_4_ * auVar138._12_4_;
  auVar198 = vsubps_avx(auVar224,auVar215);
  auVar15 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar198 = vshufps_avx(auVar264,auVar264,0xc9);
  auVar216._0_4_ = fVar259 * auVar198._0_4_;
  auVar216._4_4_ = fVar260 * auVar198._4_4_;
  auVar216._8_4_ = fVar261 * auVar198._8_4_;
  auVar216._12_4_ = fVar270 * auVar198._12_4_;
  auVar176._0_4_ = auVar264._0_4_ * auVar138._0_4_;
  auVar176._4_4_ = auVar264._4_4_ * auVar138._4_4_;
  auVar176._8_4_ = auVar264._8_4_ * auVar138._8_4_;
  auVar176._12_4_ = auVar264._12_4_ * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar176,auVar216);
  auVar264 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar198 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar138 = vshufps_avx(auVar234,auVar234,0xc9);
  fVar271 = auVar65._0_4_;
  auVar177._0_4_ = fVar271 * auVar138._0_4_;
  fVar272 = auVar65._4_4_;
  auVar177._4_4_ = fVar272 * auVar138._4_4_;
  fVar273 = auVar65._8_4_;
  auVar177._8_4_ = fVar273 * auVar138._8_4_;
  fVar277 = auVar65._12_4_;
  auVar177._12_4_ = fVar277 * auVar138._12_4_;
  auVar235._0_4_ = auVar234._0_4_ * auVar198._0_4_;
  auVar235._4_4_ = auVar234._4_4_ * auVar198._4_4_;
  auVar235._8_4_ = auVar234._8_4_ * auVar198._8_4_;
  auVar235._12_4_ = auVar234._12_4_ * auVar198._12_4_;
  auVar138 = vsubps_avx(auVar235,auVar177);
  auVar16 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar138 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar236._0_4_ = auVar138._0_4_ * fVar271;
  auVar236._4_4_ = auVar138._4_4_ * fVar272;
  auVar236._8_4_ = auVar138._8_4_ * fVar273;
  auVar236._12_4_ = auVar138._12_4_ * fVar277;
  auVar138 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar197._0_4_ = auVar198._0_4_ * auVar66._0_4_;
  auVar197._4_4_ = auVar198._4_4_ * auVar66._4_4_;
  auVar197._8_4_ = auVar198._8_4_ * auVar66._8_4_;
  auVar197._12_4_ = auVar198._12_4_ * auVar66._12_4_;
  auVar198 = vsubps_avx(auVar197,auVar236);
  auVar66 = vshufps_avx(auVar198,auVar198,0xc9);
  fVar191 = auVar138._0_4_;
  auVar117 = ZEXT416((uint)fVar191);
  auVar198 = vrsqrtss_avx(auVar117,auVar117);
  fVar172 = auVar198._0_4_;
  auVar198 = ZEXT416((uint)(fVar172 * 1.5 - fVar191 * 0.5 * fVar172 * fVar172 * fVar172));
  auVar96 = vshufps_avx(auVar198,auVar198,0);
  auVar198 = vdpps_avx(auVar15,auVar264,0x7f);
  fVar172 = auVar15._0_4_ * auVar96._0_4_;
  fVar142 = auVar15._4_4_ * auVar96._4_4_;
  fVar190 = auVar15._8_4_ * auVar96._8_4_;
  fVar151 = auVar15._12_4_ * auVar96._12_4_;
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar253._0_4_ = auVar264._0_4_ * auVar138._0_4_;
  auVar253._4_4_ = auVar264._4_4_ * auVar138._4_4_;
  auVar253._8_4_ = auVar264._8_4_ * auVar138._8_4_;
  auVar253._12_4_ = auVar264._12_4_ * auVar138._12_4_;
  auVar138 = vshufps_avx(auVar198,auVar198,0);
  auVar225._0_4_ = auVar15._0_4_ * auVar138._0_4_;
  auVar225._4_4_ = auVar15._4_4_ * auVar138._4_4_;
  auVar225._8_4_ = auVar15._8_4_ * auVar138._8_4_;
  auVar225._12_4_ = auVar15._12_4_ * auVar138._12_4_;
  auVar92 = vsubps_avx(auVar253,auVar225);
  auVar138 = vrcpss_avx(auVar117,auVar117);
  auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar191 * auVar138._0_4_)));
  auVar15 = vshufps_avx(auVar138,auVar138,0);
  auVar138 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar191 = auVar138._0_4_;
  auVar117 = ZEXT416((uint)fVar191);
  auVar198 = vrsqrtss_avx(auVar117,auVar117);
  fVar152 = auVar198._0_4_;
  auVar198 = vdpps_avx(auVar16,auVar66,0x7f);
  auVar264 = ZEXT416((uint)(fVar152 * 1.5 - fVar191 * 0.5 * fVar152 * fVar152 * fVar152));
  auVar264 = vshufps_avx(auVar264,auVar264,0);
  fVar152 = auVar264._0_4_ * auVar16._0_4_;
  fVar192 = auVar264._4_4_ * auVar16._4_4_;
  fVar153 = auVar264._8_4_ * auVar16._8_4_;
  fVar193 = auVar264._12_4_ * auVar16._12_4_;
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar217._0_4_ = auVar138._0_4_ * auVar66._0_4_;
  auVar217._4_4_ = auVar138._4_4_ * auVar66._4_4_;
  auVar217._8_4_ = auVar138._8_4_ * auVar66._8_4_;
  auVar217._12_4_ = auVar138._12_4_ * auVar66._12_4_;
  auVar138 = vshufps_avx(auVar198,auVar198,0);
  auVar178._0_4_ = auVar138._0_4_ * auVar16._0_4_;
  auVar178._4_4_ = auVar138._4_4_ * auVar16._4_4_;
  auVar178._8_4_ = auVar138._8_4_ * auVar16._8_4_;
  auVar178._12_4_ = auVar138._12_4_ * auVar16._12_4_;
  auVar66 = vsubps_avx(auVar217,auVar178);
  auVar138 = vrcpss_avx(auVar117,auVar117);
  auVar138 = ZEXT416((uint)((2.0 - fVar191 * auVar138._0_4_) * auVar138._0_4_));
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar198 = vshufps_avx(_local_6a0,_local_6a0,0xff);
  auVar237._0_4_ = auVar198._0_4_ * fVar172;
  auVar237._4_4_ = auVar198._4_4_ * fVar142;
  auVar237._8_4_ = auVar198._8_4_ * fVar190;
  auVar237._12_4_ = auVar198._12_4_ * fVar151;
  _local_4d0 = vsubps_avx(_local_6a0,auVar237);
  auVar16 = vshufps_avx(auVar126,auVar126,0xff);
  auVar199._0_4_ =
       auVar16._0_4_ * fVar172 + auVar96._0_4_ * auVar92._0_4_ * auVar15._0_4_ * auVar198._0_4_;
  auVar199._4_4_ =
       auVar16._4_4_ * fVar142 + auVar96._4_4_ * auVar92._4_4_ * auVar15._4_4_ * auVar198._4_4_;
  auVar199._8_4_ =
       auVar16._8_4_ * fVar190 + auVar96._8_4_ * auVar92._8_4_ * auVar15._8_4_ * auVar198._8_4_;
  auVar199._12_4_ =
       auVar16._12_4_ * fVar151 + auVar96._12_4_ * auVar92._12_4_ * auVar15._12_4_ * auVar198._12_4_
  ;
  auVar16 = vsubps_avx(auVar126,auVar199);
  local_4e0._0_4_ = auVar237._0_4_ + (float)local_6a0._0_4_;
  local_4e0._4_4_ = auVar237._4_4_ + (float)local_6a0._4_4_;
  fStack_4d8 = auVar237._8_4_ + fStack_698;
  fStack_4d4 = auVar237._12_4_ + fStack_694;
  auVar198 = vshufps_avx(auVar146,auVar146,0xff);
  auVar121._0_4_ = fVar152 * auVar198._0_4_;
  auVar121._4_4_ = fVar192 * auVar198._4_4_;
  auVar121._8_4_ = fVar153 * auVar198._8_4_;
  auVar121._12_4_ = fVar193 * auVar198._12_4_;
  _local_4f0 = vsubps_avx(auVar146,auVar121);
  auVar15 = vshufps_avx(auVar65,auVar65,0xff);
  auVar93._0_4_ =
       fVar152 * auVar15._0_4_ + auVar198._0_4_ * auVar264._0_4_ * auVar66._0_4_ * auVar138._0_4_;
  auVar93._4_4_ =
       fVar192 * auVar15._4_4_ + auVar198._4_4_ * auVar264._4_4_ * auVar66._4_4_ * auVar138._4_4_;
  auVar93._8_4_ =
       fVar153 * auVar15._8_4_ + auVar198._8_4_ * auVar264._8_4_ * auVar66._8_4_ * auVar138._8_4_;
  auVar93._12_4_ =
       fVar193 * auVar15._12_4_ +
       auVar198._12_4_ * auVar264._12_4_ * auVar66._12_4_ * auVar138._12_4_;
  auVar264 = vsubps_avx(auVar65,auVar93);
  local_500._0_4_ = auVar146._0_4_ + auVar121._0_4_;
  local_500._4_4_ = auVar146._4_4_ + auVar121._4_4_;
  fStack_4f8 = auVar146._8_4_ + auVar121._8_4_;
  fStack_4f4 = auVar146._12_4_ + auVar121._12_4_;
  local_510._0_4_ = local_4d0._0_4_ + auVar16._0_4_ * 0.33333334;
  local_510._4_4_ = local_4d0._4_4_ + auVar16._4_4_ * 0.33333334;
  fStack_508 = local_4d0._8_4_ + auVar16._8_4_ * 0.33333334;
  fStack_504 = local_4d0._12_4_ + auVar16._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_4d0,auVar136);
  auVar198 = vmovsldup_avx(local_380);
  auVar138 = vmovshdup_avx(local_380);
  auVar15 = vshufps_avx(local_380,local_380,0xaa);
  fVar172 = pre->ray_space[k].vx.field_0.m128[0];
  fVar142 = pre->ray_space[k].vx.field_0.m128[1];
  fVar190 = pre->ray_space[k].vx.field_0.m128[2];
  fVar151 = pre->ray_space[k].vx.field_0.m128[3];
  fVar191 = pre->ray_space[k].vy.field_0.m128[0];
  fVar152 = pre->ray_space[k].vy.field_0.m128[1];
  fVar192 = pre->ray_space[k].vy.field_0.m128[2];
  fVar153 = pre->ray_space[k].vy.field_0.m128[3];
  fVar193 = pre->ray_space[k].vz.field_0.m128[0];
  fVar208 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  fVar89 = fVar172 * auVar198._0_4_ + auVar15._0_4_ * fVar193 + fVar191 * auVar138._0_4_;
  fVar115 = fVar142 * auVar198._4_4_ + auVar15._4_4_ * fVar208 + fVar152 * auVar138._4_4_;
  local_640._4_4_ = fVar115;
  local_640._0_4_ = fVar89;
  fStack_638 = fVar190 * auVar198._8_4_ + auVar15._8_4_ * fVar209 + fVar192 * auVar138._8_4_;
  fStack_634 = fVar151 * auVar198._12_4_ + auVar15._12_4_ * fVar210 + fVar153 * auVar138._12_4_;
  local_390 = vsubps_avx(_local_510,auVar136);
  auVar15 = vshufps_avx(local_390,local_390,0xaa);
  auVar138 = vmovshdup_avx(local_390);
  auVar198 = vmovsldup_avx(local_390);
  fVar90 = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
  fVar252 = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + fVar208 * auVar15._4_4_;
  local_600._4_4_ = fVar252;
  local_600._0_4_ = fVar90;
  fStack_5f8 = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + fVar209 * auVar15._8_4_;
  fStack_5f4 = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + fVar210 * auVar15._12_4_;
  auVar179._0_4_ = auVar264._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar264._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar264._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar264._12_4_ * 0.33333334;
  _local_520 = vsubps_avx(_local_4f0,auVar179);
  local_3a0 = vsubps_avx(_local_520,auVar136);
  auVar15 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar138 = vmovshdup_avx(local_3a0);
  auVar198 = vmovsldup_avx(local_3a0);
  fVar91 = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
  fVar258 = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + fVar208 * auVar15._4_4_;
  local_630._4_4_ = fVar258;
  local_630._0_4_ = fVar91;
  fStack_628 = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + fVar209 * auVar15._8_4_;
  fStack_624 = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + fVar210 * auVar15._12_4_;
  local_3b0 = vsubps_avx(_local_4f0,auVar136);
  auVar15 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar138 = vmovshdup_avx(local_3b0);
  auVar198 = vmovsldup_avx(local_3b0);
  auVar286._0_4_ = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
  auVar286._4_4_ = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + auVar15._4_4_ * fVar208;
  auVar286._8_4_ = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + auVar15._8_4_ * fVar209;
  auVar286._12_4_ = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + auVar15._12_4_ * fVar210
  ;
  local_3c0 = vsubps_avx(_local_4e0,auVar136);
  auVar15 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar138 = vmovshdup_avx(local_3c0);
  auVar198 = vmovsldup_avx(local_3c0);
  auVar180._0_4_ = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
  auVar180._4_4_ = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + auVar15._4_4_ * fVar208;
  auVar180._8_4_ = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + auVar15._8_4_ * fVar209;
  auVar180._12_4_ = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + auVar15._12_4_ * fVar210
  ;
  local_530._0_4_ = (float)local_4e0._0_4_ + (fVar259 + auVar199._0_4_) * 0.33333334;
  local_530._4_4_ = (float)local_4e0._4_4_ + (fVar260 + auVar199._4_4_) * 0.33333334;
  fStack_528 = fStack_4d8 + (fVar261 + auVar199._8_4_) * 0.33333334;
  fStack_524 = fStack_4d4 + (fVar270 + auVar199._12_4_) * 0.33333334;
  local_3d0 = vsubps_avx(_local_530,auVar136);
  auVar15 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar138 = vmovshdup_avx(local_3d0);
  auVar198 = vmovsldup_avx(local_3d0);
  auVar275._0_4_ = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
  auVar275._4_4_ = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + auVar15._4_4_ * fVar208;
  auVar275._8_4_ = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + auVar15._8_4_ * fVar209;
  auVar275._12_4_ = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + auVar15._12_4_ * fVar210
  ;
  auVar218._0_4_ = (fVar271 + auVar93._0_4_) * 0.33333334;
  auVar218._4_4_ = (fVar272 + auVar93._4_4_) * 0.33333334;
  auVar218._8_4_ = (fVar273 + auVar93._8_4_) * 0.33333334;
  auVar218._12_4_ = (fVar277 + auVar93._12_4_) * 0.33333334;
  _local_420 = vsubps_avx(_local_500,auVar218);
  local_3e0 = vsubps_avx(_local_420,auVar136);
  auVar15 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar138 = vmovshdup_avx(local_3e0);
  auVar198 = vmovsldup_avx(local_3e0);
  auVar254._0_4_ = auVar198._0_4_ * fVar172 + auVar138._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
  auVar254._4_4_ = auVar198._4_4_ * fVar142 + auVar138._4_4_ * fVar152 + fVar208 * auVar15._4_4_;
  auVar254._8_4_ = auVar198._8_4_ * fVar190 + auVar138._8_4_ * fVar192 + fVar209 * auVar15._8_4_;
  auVar254._12_4_ = auVar198._12_4_ * fVar151 + auVar138._12_4_ * fVar153 + fVar210 * auVar15._12_4_
  ;
  local_3f0 = vsubps_avx(_local_500,auVar136);
  auVar136 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar138 = vmovshdup_avx(local_3f0);
  auVar198 = vmovsldup_avx(local_3f0);
  auVar238._0_4_ = fVar172 * auVar198._0_4_ + fVar191 * auVar138._0_4_ + fVar193 * auVar136._0_4_;
  auVar238._4_4_ = fVar142 * auVar198._4_4_ + fVar152 * auVar138._4_4_ + fVar208 * auVar136._4_4_;
  auVar238._8_4_ = fVar190 * auVar198._8_4_ + fVar192 * auVar138._8_4_ + fVar209 * auVar136._8_4_;
  auVar238._12_4_ =
       fVar151 * auVar198._12_4_ + fVar153 * auVar138._12_4_ + fVar210 * auVar136._12_4_;
  auVar15 = vmovlhps_avx(_local_640,auVar180);
  auVar264 = vmovlhps_avx(_local_600,auVar275);
  auVar16 = vmovlhps_avx(_local_630,auVar254);
  _local_4b0 = vmovlhps_avx(auVar286,auVar238);
  auVar138 = vminps_avx(auVar15,auVar264);
  auVar198 = vminps_avx(auVar16,_local_4b0);
  auVar136 = vminps_avx(auVar138,auVar198);
  auVar138 = vmaxps_avx(auVar15,auVar264);
  auVar198 = vmaxps_avx(auVar16,_local_4b0);
  auVar138 = vmaxps_avx(auVar138,auVar198);
  auVar198 = vshufpd_avx(auVar136,auVar136,3);
  auVar136 = vminps_avx(auVar136,auVar198);
  auVar198 = vshufpd_avx(auVar138,auVar138,3);
  auVar198 = vmaxps_avx(auVar138,auVar198);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar138 = vandps_avx(auVar136,auVar200);
  auVar198 = vandps_avx(auVar198,auVar200);
  auVar138 = vmaxps_avx(auVar138,auVar198);
  auVar198 = vmovshdup_avx(auVar138);
  auVar138 = vmaxss_avx(auVar198,auVar138);
  fVar172 = auVar138._0_4_ * 9.536743e-07;
  local_4c0 = ZEXT416((uint)fVar172);
  auVar138 = vshufps_avx(local_4c0,ZEXT416((uint)fVar172),0);
  local_1c0._16_16_ = auVar138;
  local_1c0._0_16_ = auVar138;
  auVar67._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
  auVar67._8_4_ = auVar138._8_4_ ^ 0x80000000;
  auVar67._12_4_ = auVar138._12_4_ ^ 0x80000000;
  local_340._16_16_ = auVar67;
  local_340._0_16_ = auVar67;
  auVar138 = vpshufd_avx(ZEXT416(uVar55),0);
  local_2e0._16_16_ = auVar138;
  local_2e0._0_16_ = auVar138;
  auVar138 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar58 * 4 + 6)),0);
  local_300._16_16_ = auVar138;
  local_300._0_16_ = auVar138;
  bVar64 = false;
  uVar63 = 0;
  fVar172 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar264,auVar15);
  _local_360 = vsubps_avx(auVar16,auVar264);
  _local_370 = vsubps_avx(_local_4b0,auVar16);
  _local_430 = vsubps_avx(_local_4e0,_local_4d0);
  _local_440 = vsubps_avx(_local_530,_local_510);
  _local_450 = vsubps_avx(_local_420,_local_520);
  _local_460 = vsubps_avx(_local_500,_local_4f0);
  auVar207 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar289 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e12109:
  do {
    local_400 = auVar289._0_16_;
    auVar118 = auVar207._0_16_;
    auVar138 = vshufps_avx(auVar118,auVar118,0x50);
    auVar295._8_4_ = 0x3f800000;
    auVar295._0_8_ = 0x3f8000003f800000;
    auVar295._12_4_ = 0x3f800000;
    auVar298._16_4_ = 0x3f800000;
    auVar298._0_16_ = auVar295;
    auVar298._20_4_ = 0x3f800000;
    auVar298._24_4_ = 0x3f800000;
    auVar298._28_4_ = 0x3f800000;
    auVar198 = vsubps_avx(auVar295,auVar138);
    fVar142 = auVar138._0_4_;
    fVar151 = auVar138._4_4_;
    fVar152 = auVar138._8_4_;
    fVar153 = auVar138._12_4_;
    fVar190 = auVar198._0_4_;
    fVar191 = auVar198._4_4_;
    fVar192 = auVar198._8_4_;
    fVar193 = auVar198._12_4_;
    auVar147._0_4_ = auVar180._0_4_ * fVar142 + fVar89 * fVar190;
    auVar147._4_4_ = auVar180._4_4_ * fVar151 + fVar115 * fVar191;
    auVar147._8_4_ = auVar180._0_4_ * fVar152 + fVar89 * fVar192;
    auVar147._12_4_ = auVar180._4_4_ * fVar153 + fVar115 * fVar193;
    auVar122._0_4_ = auVar275._0_4_ * fVar142 + fVar90 * fVar190;
    auVar122._4_4_ = auVar275._4_4_ * fVar151 + fVar252 * fVar191;
    auVar122._8_4_ = auVar275._0_4_ * fVar152 + fVar90 * fVar192;
    auVar122._12_4_ = auVar275._4_4_ * fVar153 + fVar252 * fVar193;
    auVar219._0_4_ = auVar254._0_4_ * fVar142 + fVar91 * fVar190;
    auVar219._4_4_ = auVar254._4_4_ * fVar151 + fVar258 * fVar191;
    auVar219._8_4_ = auVar254._0_4_ * fVar152 + fVar91 * fVar192;
    auVar219._12_4_ = auVar254._4_4_ * fVar153 + fVar258 * fVar193;
    auVar158._0_4_ = auVar238._0_4_ * fVar142 + auVar286._0_4_ * fVar190;
    auVar158._4_4_ = auVar238._4_4_ * fVar151 + auVar286._4_4_ * fVar191;
    auVar158._8_4_ = auVar238._0_4_ * fVar152 + auVar286._0_4_ * fVar192;
    auVar158._12_4_ = auVar238._4_4_ * fVar153 + auVar286._4_4_ * fVar193;
    auVar138 = vmovshdup_avx(local_400);
    auVar198 = vshufps_avx(local_400,local_400,0);
    auVar244._16_16_ = auVar198;
    auVar244._0_16_ = auVar198;
    auVar136 = vshufps_avx(local_400,local_400,0x55);
    auVar83._16_16_ = auVar136;
    auVar83._0_16_ = auVar136;
    auVar82 = vsubps_avx(auVar83,auVar244);
    auVar136 = vshufps_avx(auVar147,auVar147,0);
    auVar66 = vshufps_avx(auVar147,auVar147,0x55);
    auVar96 = vshufps_avx(auVar122,auVar122,0);
    auVar126 = vshufps_avx(auVar122,auVar122,0x55);
    auVar65 = vshufps_avx(auVar219,auVar219,0);
    auVar92 = vshufps_avx(auVar219,auVar219,0x55);
    auVar117 = vshufps_avx(auVar158,auVar158,0);
    auVar116 = vshufps_avx(auVar158,auVar158,0x55);
    auVar138 = ZEXT416((uint)((auVar138._0_4_ - auVar289._0_4_) * 0.04761905));
    auVar138 = vshufps_avx(auVar138,auVar138,0);
    auVar257._0_4_ = auVar198._0_4_ + auVar82._0_4_ * 0.0;
    auVar257._4_4_ = auVar198._4_4_ + auVar82._4_4_ * 0.14285715;
    auVar257._8_4_ = auVar198._8_4_ + auVar82._8_4_ * 0.2857143;
    auVar257._12_4_ = auVar198._12_4_ + auVar82._12_4_ * 0.42857146;
    auVar257._16_4_ = auVar198._0_4_ + auVar82._16_4_ * 0.5714286;
    auVar257._20_4_ = auVar198._4_4_ + auVar82._20_4_ * 0.71428573;
    auVar257._24_4_ = auVar198._8_4_ + auVar82._24_4_ * 0.8571429;
    auVar257._28_4_ = auVar198._12_4_ + auVar82._28_4_;
    auVar17 = vsubps_avx(auVar298,auVar257);
    fVar142 = auVar96._0_4_;
    fVar151 = auVar96._4_4_;
    fVar152 = auVar96._8_4_;
    fVar153 = auVar96._12_4_;
    fVar301 = auVar17._0_4_;
    fVar246 = auVar17._4_4_;
    fVar247 = auVar17._8_4_;
    fVar248 = auVar17._12_4_;
    fVar249 = auVar17._16_4_;
    fVar250 = auVar17._20_4_;
    fVar251 = auVar17._24_4_;
    fVar279 = auVar126._0_4_;
    fVar290 = auVar126._4_4_;
    fVar292 = auVar126._8_4_;
    fVar299 = auVar126._12_4_;
    fVar293 = auVar66._12_4_ + 1.0;
    fVar272 = auVar65._0_4_;
    fVar273 = auVar65._4_4_;
    fVar277 = auVar65._8_4_;
    fVar278 = auVar65._12_4_;
    fVar208 = fVar272 * auVar257._0_4_ + fVar301 * fVar142;
    fVar209 = fVar273 * auVar257._4_4_ + fVar246 * fVar151;
    fVar210 = fVar277 * auVar257._8_4_ + fVar247 * fVar152;
    fVar259 = fVar278 * auVar257._12_4_ + fVar248 * fVar153;
    fVar260 = fVar272 * auVar257._16_4_ + fVar249 * fVar142;
    fVar261 = fVar273 * auVar257._20_4_ + fVar250 * fVar151;
    fVar270 = fVar277 * auVar257._24_4_ + fVar251 * fVar152;
    fVar190 = auVar92._0_4_;
    fVar191 = auVar92._4_4_;
    fVar192 = auVar92._8_4_;
    fVar193 = auVar92._12_4_;
    fVar284 = fVar279 * fVar301 + auVar257._0_4_ * fVar190;
    fVar291 = fVar290 * fVar246 + auVar257._4_4_ * fVar191;
    fVar294 = fVar292 * fVar247 + auVar257._8_4_ * fVar192;
    fVar300 = fVar299 * fVar248 + auVar257._12_4_ * fVar193;
    fVar280 = fVar279 * fVar249 + auVar257._16_4_ * fVar190;
    fVar281 = fVar290 * fVar250 + auVar257._20_4_ * fVar191;
    fVar282 = fVar292 * fVar251 + auVar257._24_4_ * fVar192;
    fVar283 = fVar299 + fVar153;
    auVar198 = vshufps_avx(auVar147,auVar147,0xaa);
    auVar96 = vshufps_avx(auVar147,auVar147,0xff);
    fVar271 = fVar278 + 0.0;
    auVar126 = vshufps_avx(auVar122,auVar122,0xaa);
    auVar65 = vshufps_avx(auVar122,auVar122,0xff);
    auVar170._0_4_ =
         fVar301 * (auVar257._0_4_ * fVar142 + fVar301 * auVar136._0_4_) + auVar257._0_4_ * fVar208;
    auVar170._4_4_ =
         fVar246 * (auVar257._4_4_ * fVar151 + fVar246 * auVar136._4_4_) + auVar257._4_4_ * fVar209;
    auVar170._8_4_ =
         fVar247 * (auVar257._8_4_ * fVar152 + fVar247 * auVar136._8_4_) + auVar257._8_4_ * fVar210;
    auVar170._12_4_ =
         fVar248 * (auVar257._12_4_ * fVar153 + fVar248 * auVar136._12_4_) +
         auVar257._12_4_ * fVar259;
    auVar170._16_4_ =
         fVar249 * (auVar257._16_4_ * fVar142 + fVar249 * auVar136._0_4_) +
         auVar257._16_4_ * fVar260;
    auVar170._20_4_ =
         fVar250 * (auVar257._20_4_ * fVar151 + fVar250 * auVar136._4_4_) +
         auVar257._20_4_ * fVar261;
    auVar170._24_4_ =
         fVar251 * (auVar257._24_4_ * fVar152 + fVar251 * auVar136._8_4_) +
         auVar257._24_4_ * fVar270;
    auVar170._28_4_ = auVar136._12_4_ + 1.0 + fVar193;
    auVar188._0_4_ =
         fVar301 * (fVar279 * auVar257._0_4_ + auVar66._0_4_ * fVar301) + auVar257._0_4_ * fVar284;
    auVar188._4_4_ =
         fVar246 * (fVar290 * auVar257._4_4_ + auVar66._4_4_ * fVar246) + auVar257._4_4_ * fVar291;
    auVar188._8_4_ =
         fVar247 * (fVar292 * auVar257._8_4_ + auVar66._8_4_ * fVar247) + auVar257._8_4_ * fVar294;
    auVar188._12_4_ =
         fVar248 * (fVar299 * auVar257._12_4_ + auVar66._12_4_ * fVar248) +
         auVar257._12_4_ * fVar300;
    auVar188._16_4_ =
         fVar249 * (fVar279 * auVar257._16_4_ + auVar66._0_4_ * fVar249) + auVar257._16_4_ * fVar280
    ;
    auVar188._20_4_ =
         fVar250 * (fVar290 * auVar257._20_4_ + auVar66._4_4_ * fVar250) + auVar257._20_4_ * fVar281
    ;
    auVar188._24_4_ =
         fVar251 * (fVar292 * auVar257._24_4_ + auVar66._8_4_ * fVar251) + auVar257._24_4_ * fVar282
    ;
    auVar188._28_4_ = auVar116._12_4_ + fVar193;
    auVar84._0_4_ =
         fVar301 * fVar208 + auVar257._0_4_ * (fVar272 * fVar301 + auVar117._0_4_ * auVar257._0_4_);
    auVar84._4_4_ =
         fVar246 * fVar209 + auVar257._4_4_ * (fVar273 * fVar246 + auVar117._4_4_ * auVar257._4_4_);
    auVar84._8_4_ =
         fVar247 * fVar210 + auVar257._8_4_ * (fVar277 * fVar247 + auVar117._8_4_ * auVar257._8_4_);
    auVar84._12_4_ =
         fVar248 * fVar259 +
         auVar257._12_4_ * (fVar278 * fVar248 + auVar117._12_4_ * auVar257._12_4_);
    auVar84._16_4_ =
         fVar249 * fVar260 +
         auVar257._16_4_ * (fVar272 * fVar249 + auVar117._0_4_ * auVar257._16_4_);
    auVar84._20_4_ =
         fVar250 * fVar261 +
         auVar257._20_4_ * (fVar273 * fVar250 + auVar117._4_4_ * auVar257._20_4_);
    auVar84._24_4_ =
         fVar251 * fVar270 +
         auVar257._24_4_ * (fVar277 * fVar251 + auVar117._8_4_ * auVar257._24_4_);
    auVar84._28_4_ = fVar153 + 1.0 + fVar271;
    auVar269._0_4_ =
         fVar301 * fVar284 + auVar257._0_4_ * (auVar116._0_4_ * auVar257._0_4_ + fVar301 * fVar190);
    auVar269._4_4_ =
         fVar246 * fVar291 + auVar257._4_4_ * (auVar116._4_4_ * auVar257._4_4_ + fVar246 * fVar191);
    auVar269._8_4_ =
         fVar247 * fVar294 + auVar257._8_4_ * (auVar116._8_4_ * auVar257._8_4_ + fVar247 * fVar192);
    auVar269._12_4_ =
         fVar248 * fVar300 +
         auVar257._12_4_ * (auVar116._12_4_ * auVar257._12_4_ + fVar248 * fVar193);
    auVar269._16_4_ =
         fVar249 * fVar280 +
         auVar257._16_4_ * (auVar116._0_4_ * auVar257._16_4_ + fVar249 * fVar190);
    auVar269._20_4_ =
         fVar250 * fVar281 +
         auVar257._20_4_ * (auVar116._4_4_ * auVar257._20_4_ + fVar250 * fVar191);
    auVar269._24_4_ =
         fVar251 * fVar282 +
         auVar257._24_4_ * (auVar116._8_4_ * auVar257._24_4_ + fVar251 * fVar192);
    auVar269._28_4_ = fVar271 + fVar193 + 0.0;
    local_200._0_4_ = fVar301 * auVar170._0_4_ + auVar257._0_4_ * auVar84._0_4_;
    local_200._4_4_ = fVar246 * auVar170._4_4_ + auVar257._4_4_ * auVar84._4_4_;
    local_200._8_4_ = fVar247 * auVar170._8_4_ + auVar257._8_4_ * auVar84._8_4_;
    local_200._12_4_ = fVar248 * auVar170._12_4_ + auVar257._12_4_ * auVar84._12_4_;
    local_200._16_4_ = fVar249 * auVar170._16_4_ + auVar257._16_4_ * auVar84._16_4_;
    local_200._20_4_ = fVar250 * auVar170._20_4_ + auVar257._20_4_ * auVar84._20_4_;
    local_200._24_4_ = fVar251 * auVar170._24_4_ + auVar257._24_4_ * auVar84._24_4_;
    local_200._28_4_ = fVar283 + fVar193 + 0.0;
    auVar150._0_4_ = fVar301 * auVar188._0_4_ + auVar257._0_4_ * auVar269._0_4_;
    auVar150._4_4_ = fVar246 * auVar188._4_4_ + auVar257._4_4_ * auVar269._4_4_;
    auVar150._8_4_ = fVar247 * auVar188._8_4_ + auVar257._8_4_ * auVar269._8_4_;
    auVar150._12_4_ = fVar248 * auVar188._12_4_ + auVar257._12_4_ * auVar269._12_4_;
    auVar150._16_4_ = fVar249 * auVar188._16_4_ + auVar257._16_4_ * auVar269._16_4_;
    auVar150._20_4_ = fVar250 * auVar188._20_4_ + auVar257._20_4_ * auVar269._20_4_;
    auVar150._24_4_ = fVar251 * auVar188._24_4_ + auVar257._24_4_ * auVar269._24_4_;
    auVar150._28_4_ = fVar283 + fVar271;
    auVar18 = vsubps_avx(auVar84,auVar170);
    auVar82 = vsubps_avx(auVar269,auVar188);
    local_5e0 = auVar138._0_4_;
    fStack_5dc = auVar138._4_4_;
    fStack_5d8 = auVar138._8_4_;
    fStack_5d4 = auVar138._12_4_;
    local_240 = local_5e0 * auVar18._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar18._4_4_ * 3.0;
    auVar19._4_4_ = fStack_23c;
    auVar19._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar18._8_4_ * 3.0;
    auVar19._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar18._12_4_ * 3.0;
    auVar19._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar18._16_4_ * 3.0;
    auVar19._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar18._20_4_ * 3.0;
    auVar19._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar18._24_4_ * 3.0;
    auVar19._24_4_ = fStack_228;
    auVar19._28_4_ = auVar18._28_4_;
    local_260 = local_5e0 * auVar82._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar82._4_4_ * 3.0;
    auVar20._4_4_ = fStack_25c;
    auVar20._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar82._8_4_ * 3.0;
    auVar20._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar82._12_4_ * 3.0;
    auVar20._12_4_ = fStack_254;
    fStack_250 = local_5e0 * auVar82._16_4_ * 3.0;
    auVar20._16_4_ = fStack_250;
    fStack_24c = fStack_5dc * auVar82._20_4_ * 3.0;
    auVar20._20_4_ = fStack_24c;
    fStack_248 = fStack_5d8 * auVar82._24_4_ * 3.0;
    auVar20._24_4_ = fStack_248;
    auVar20._28_4_ = fVar283;
    auVar19 = vsubps_avx(local_200,auVar19);
    auVar82 = vperm2f128_avx(auVar19,auVar19,1);
    auVar82 = vshufps_avx(auVar82,auVar19,0x30);
    auVar82 = vshufps_avx(auVar19,auVar82,0x29);
    auVar20 = vsubps_avx(auVar150,auVar20);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar281 = auVar126._0_4_;
    fVar282 = auVar126._4_4_;
    fVar303 = auVar126._8_4_;
    fVar153 = auVar198._12_4_;
    fVar273 = auVar65._0_4_;
    fVar278 = auVar65._4_4_;
    fVar284 = auVar65._8_4_;
    fVar291 = auVar65._12_4_;
    auVar138 = vshufps_avx(auVar219,auVar219,0xaa);
    fVar142 = auVar138._0_4_;
    fVar151 = auVar138._4_4_;
    fVar152 = auVar138._8_4_;
    fVar193 = auVar138._12_4_;
    fVar210 = auVar257._0_4_ * fVar142 + fVar281 * fVar301;
    fVar259 = auVar257._4_4_ * fVar151 + fVar282 * fVar246;
    fVar260 = auVar257._8_4_ * fVar152 + fVar303 * fVar247;
    fVar261 = auVar257._12_4_ * fVar193 + auVar126._12_4_ * fVar248;
    fVar270 = auVar257._16_4_ * fVar142 + fVar281 * fVar249;
    fVar271 = auVar257._20_4_ * fVar151 + fVar282 * fVar250;
    fVar272 = auVar257._24_4_ * fVar152 + fVar303 * fVar251;
    auVar138 = vshufps_avx(auVar219,auVar219,0xff);
    fVar190 = auVar138._0_4_;
    fVar191 = auVar138._4_4_;
    fVar192 = auVar138._8_4_;
    fVar208 = auVar138._12_4_;
    fVar277 = auVar257._0_4_ * fVar190 + fVar273 * fVar301;
    fVar279 = auVar257._4_4_ * fVar191 + fVar278 * fVar246;
    fVar290 = auVar257._8_4_ * fVar192 + fVar284 * fVar247;
    fVar292 = auVar257._12_4_ * fVar208 + fVar291 * fVar248;
    fVar294 = auVar257._16_4_ * fVar190 + fVar273 * fVar249;
    fVar299 = auVar257._20_4_ * fVar191 + fVar278 * fVar250;
    fVar300 = auVar257._24_4_ * fVar192 + fVar284 * fVar251;
    auVar138 = vshufps_avx(auVar158,auVar158,0xaa);
    fVar280 = auVar138._12_4_ + fVar193;
    auVar136 = vshufps_avx(auVar158,auVar158,0xff);
    fVar209 = auVar136._12_4_;
    auVar85._0_4_ =
         fVar301 * (fVar281 * auVar257._0_4_ + fVar301 * auVar198._0_4_) + auVar257._0_4_ * fVar210;
    auVar85._4_4_ =
         fVar246 * (fVar282 * auVar257._4_4_ + fVar246 * auVar198._4_4_) + auVar257._4_4_ * fVar259;
    auVar85._8_4_ =
         fVar247 * (fVar303 * auVar257._8_4_ + fVar247 * auVar198._8_4_) + auVar257._8_4_ * fVar260;
    auVar85._12_4_ =
         fVar248 * (auVar126._12_4_ * auVar257._12_4_ + fVar248 * fVar153) +
         auVar257._12_4_ * fVar261;
    auVar85._16_4_ =
         fVar249 * (fVar281 * auVar257._16_4_ + fVar249 * auVar198._0_4_) +
         auVar257._16_4_ * fVar270;
    auVar85._20_4_ =
         fVar250 * (fVar282 * auVar257._20_4_ + fVar250 * auVar198._4_4_) +
         auVar257._20_4_ * fVar271;
    auVar85._24_4_ =
         fVar251 * (fVar303 * auVar257._24_4_ + fVar251 * auVar198._8_4_) +
         auVar257._24_4_ * fVar272;
    auVar85._28_4_ = auVar20._28_4_ + fVar153 + fVar209;
    auVar110._0_4_ =
         fVar301 * (fVar273 * auVar257._0_4_ + auVar96._0_4_ * fVar301) + auVar257._0_4_ * fVar277;
    auVar110._4_4_ =
         fVar246 * (fVar278 * auVar257._4_4_ + auVar96._4_4_ * fVar246) + auVar257._4_4_ * fVar279;
    auVar110._8_4_ =
         fVar247 * (fVar284 * auVar257._8_4_ + auVar96._8_4_ * fVar247) + auVar257._8_4_ * fVar290;
    auVar110._12_4_ =
         fVar248 * (fVar291 * auVar257._12_4_ + auVar96._12_4_ * fVar248) +
         auVar257._12_4_ * fVar292;
    auVar110._16_4_ =
         fVar249 * (fVar273 * auVar257._16_4_ + auVar96._0_4_ * fVar249) + auVar257._16_4_ * fVar294
    ;
    auVar110._20_4_ =
         fVar250 * (fVar278 * auVar257._20_4_ + auVar96._4_4_ * fVar250) + auVar257._20_4_ * fVar299
    ;
    auVar110._24_4_ =
         fVar251 * (fVar284 * auVar257._24_4_ + auVar96._8_4_ * fVar251) + auVar257._24_4_ * fVar300
    ;
    auVar110._28_4_ = fVar153 + auVar19._28_4_ + fVar209;
    auVar19 = vperm2f128_avx(local_200,local_200,1);
    auVar19 = vshufps_avx(auVar19,local_200,0x30);
    _local_560 = vshufps_avx(local_200,auVar19,0x29);
    auVar189._0_4_ =
         auVar257._0_4_ * (auVar138._0_4_ * auVar257._0_4_ + fVar301 * fVar142) + fVar301 * fVar210;
    auVar189._4_4_ =
         auVar257._4_4_ * (auVar138._4_4_ * auVar257._4_4_ + fVar246 * fVar151) + fVar246 * fVar259;
    auVar189._8_4_ =
         auVar257._8_4_ * (auVar138._8_4_ * auVar257._8_4_ + fVar247 * fVar152) + fVar247 * fVar260;
    auVar189._12_4_ =
         auVar257._12_4_ * (auVar138._12_4_ * auVar257._12_4_ + fVar248 * fVar193) +
         fVar248 * fVar261;
    auVar189._16_4_ =
         auVar257._16_4_ * (auVar138._0_4_ * auVar257._16_4_ + fVar249 * fVar142) +
         fVar249 * fVar270;
    auVar189._20_4_ =
         auVar257._20_4_ * (auVar138._4_4_ * auVar257._20_4_ + fVar250 * fVar151) +
         fVar250 * fVar271;
    auVar189._24_4_ =
         auVar257._24_4_ * (auVar138._8_4_ * auVar257._24_4_ + fVar251 * fVar152) +
         fVar251 * fVar272;
    auVar189._28_4_ = fVar280 + fVar293 + auVar188._28_4_;
    auVar231._0_4_ =
         fVar301 * fVar277 + auVar257._0_4_ * (auVar257._0_4_ * auVar136._0_4_ + fVar301 * fVar190);
    auVar231._4_4_ =
         fVar246 * fVar279 + auVar257._4_4_ * (auVar257._4_4_ * auVar136._4_4_ + fVar246 * fVar191);
    auVar231._8_4_ =
         fVar247 * fVar290 + auVar257._8_4_ * (auVar257._8_4_ * auVar136._8_4_ + fVar247 * fVar192);
    auVar231._12_4_ =
         fVar248 * fVar292 + auVar257._12_4_ * (auVar257._12_4_ * fVar209 + fVar248 * fVar208);
    auVar231._16_4_ =
         fVar249 * fVar294 +
         auVar257._16_4_ * (auVar257._16_4_ * auVar136._0_4_ + fVar249 * fVar190);
    auVar231._20_4_ =
         fVar250 * fVar299 +
         auVar257._20_4_ * (auVar257._20_4_ * auVar136._4_4_ + fVar250 * fVar191);
    auVar231._24_4_ =
         fVar251 * fVar300 +
         auVar257._24_4_ * (auVar257._24_4_ * auVar136._8_4_ + fVar251 * fVar192);
    auVar231._28_4_ = fVar293 + fVar291 + fVar209 + fVar208;
    auVar221._0_4_ = fVar301 * auVar85._0_4_ + auVar257._0_4_ * auVar189._0_4_;
    auVar221._4_4_ = fVar246 * auVar85._4_4_ + auVar257._4_4_ * auVar189._4_4_;
    auVar221._8_4_ = fVar247 * auVar85._8_4_ + auVar257._8_4_ * auVar189._8_4_;
    auVar221._12_4_ = fVar248 * auVar85._12_4_ + auVar257._12_4_ * auVar189._12_4_;
    auVar221._16_4_ = fVar249 * auVar85._16_4_ + auVar257._16_4_ * auVar189._16_4_;
    auVar221._20_4_ = fVar250 * auVar85._20_4_ + auVar257._20_4_ * auVar189._20_4_;
    auVar221._24_4_ = fVar251 * auVar85._24_4_ + auVar257._24_4_ * auVar189._24_4_;
    auVar221._28_4_ = fVar280 + fVar209 + fVar208;
    auVar245._0_4_ = fVar301 * auVar110._0_4_ + auVar257._0_4_ * auVar231._0_4_;
    auVar245._4_4_ = fVar246 * auVar110._4_4_ + auVar257._4_4_ * auVar231._4_4_;
    auVar245._8_4_ = fVar247 * auVar110._8_4_ + auVar257._8_4_ * auVar231._8_4_;
    auVar245._12_4_ = fVar248 * auVar110._12_4_ + auVar257._12_4_ * auVar231._12_4_;
    auVar245._16_4_ = fVar249 * auVar110._16_4_ + auVar257._16_4_ * auVar231._16_4_;
    auVar245._20_4_ = fVar250 * auVar110._20_4_ + auVar257._20_4_ * auVar231._20_4_;
    auVar245._24_4_ = fVar251 * auVar110._24_4_ + auVar257._24_4_ * auVar231._24_4_;
    auVar245._28_4_ = auVar17._28_4_ + auVar257._28_4_;
    auVar21 = vsubps_avx(auVar189,auVar85);
    auVar19 = vsubps_avx(auVar231,auVar110);
    local_280 = local_5e0 * auVar21._0_4_ * 3.0;
    fStack_27c = fStack_5dc * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_27c;
    auVar17._0_4_ = local_280;
    fStack_278 = fStack_5d8 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_278;
    fStack_274 = fStack_5d4 * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_274;
    fStack_270 = local_5e0 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_270;
    fStack_26c = fStack_5dc * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_26c;
    fStack_268 = fStack_5d8 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_268;
    auVar17._28_4_ = auVar21._28_4_;
    local_2a0 = local_5e0 * auVar19._0_4_ * 3.0;
    fStack_29c = fStack_5dc * auVar19._4_4_ * 3.0;
    auVar22._4_4_ = fStack_29c;
    auVar22._0_4_ = local_2a0;
    fStack_298 = fStack_5d8 * auVar19._8_4_ * 3.0;
    auVar22._8_4_ = fStack_298;
    fStack_294 = fStack_5d4 * auVar19._12_4_ * 3.0;
    auVar22._12_4_ = fStack_294;
    fStack_290 = local_5e0 * auVar19._16_4_ * 3.0;
    auVar22._16_4_ = fStack_290;
    fStack_28c = fStack_5dc * auVar19._20_4_ * 3.0;
    auVar22._20_4_ = fStack_28c;
    fStack_288 = fStack_5d8 * auVar19._24_4_ * 3.0;
    auVar22._24_4_ = fStack_288;
    auVar22._28_4_ = auVar189._28_4_;
    auVar19 = vperm2f128_avx(auVar221,auVar221,1);
    auVar19 = vshufps_avx(auVar19,auVar221,0x30);
    auVar83 = vshufps_avx(auVar221,auVar19,0x29);
    auVar17 = vsubps_avx(auVar221,auVar17);
    auVar19 = vperm2f128_avx(auVar17,auVar17,1);
    auVar19 = vshufps_avx(auVar19,auVar17,0x30);
    auVar19 = vshufps_avx(auVar17,auVar19,0x29);
    auVar22 = vsubps_avx(auVar245,auVar22);
    auVar17 = vperm2f128_avx(auVar22,auVar22,1);
    auVar17 = vshufps_avx(auVar17,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar17,0x29);
    auVar23 = vsubps_avx(auVar221,local_200);
    auVar84 = vsubps_avx(auVar83,_local_560);
    fVar142 = auVar84._0_4_ + auVar23._0_4_;
    fVar190 = auVar84._4_4_ + auVar23._4_4_;
    fVar151 = auVar84._8_4_ + auVar23._8_4_;
    fVar191 = auVar84._12_4_ + auVar23._12_4_;
    fVar152 = auVar84._16_4_ + auVar23._16_4_;
    fVar192 = auVar84._20_4_ + auVar23._20_4_;
    fVar153 = auVar84._24_4_ + auVar23._24_4_;
    auVar17 = vperm2f128_avx(auVar150,auVar150,1);
    auVar17 = vshufps_avx(auVar17,auVar150,0x30);
    local_220 = vshufps_avx(auVar150,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar245,auVar245,1);
    auVar17 = vshufps_avx(auVar17,auVar245,0x30);
    local_1e0 = vshufps_avx(auVar245,auVar17,0x29);
    auVar17 = vsubps_avx(auVar245,auVar150);
    auVar85 = vsubps_avx(local_1e0,local_220);
    fVar193 = auVar85._0_4_ + auVar17._0_4_;
    fVar208 = auVar85._4_4_ + auVar17._4_4_;
    fVar209 = auVar85._8_4_ + auVar17._8_4_;
    fVar210 = auVar85._12_4_ + auVar17._12_4_;
    fVar259 = auVar85._16_4_ + auVar17._16_4_;
    fVar260 = auVar85._20_4_ + auVar17._20_4_;
    fVar261 = auVar85._24_4_ + auVar17._24_4_;
    auVar24._4_4_ = fVar190 * auVar150._4_4_;
    auVar24._0_4_ = fVar142 * auVar150._0_4_;
    auVar24._8_4_ = fVar151 * auVar150._8_4_;
    auVar24._12_4_ = fVar191 * auVar150._12_4_;
    auVar24._16_4_ = fVar152 * auVar150._16_4_;
    auVar24._20_4_ = fVar192 * auVar150._20_4_;
    auVar24._24_4_ = fVar153 * auVar150._24_4_;
    auVar24._28_4_ = auVar17._28_4_;
    auVar25._4_4_ = fVar208 * local_200._4_4_;
    auVar25._0_4_ = fVar193 * local_200._0_4_;
    auVar25._8_4_ = fVar209 * local_200._8_4_;
    auVar25._12_4_ = fVar210 * local_200._12_4_;
    auVar25._16_4_ = fVar259 * local_200._16_4_;
    auVar25._20_4_ = fVar260 * local_200._20_4_;
    auVar25._24_4_ = fVar261 * local_200._24_4_;
    auVar25._28_4_ = fVar280;
    auVar24 = vsubps_avx(auVar24,auVar25);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar18._28_4_;
    local_260 = local_260 + auVar150._0_4_;
    fStack_25c = fStack_25c + auVar150._4_4_;
    fStack_258 = fStack_258 + auVar150._8_4_;
    fStack_254 = fStack_254 + auVar150._12_4_;
    fStack_250 = fStack_250 + auVar150._16_4_;
    fStack_24c = fStack_24c + auVar150._20_4_;
    fStack_248 = fStack_248 + auVar150._24_4_;
    fStack_244 = fVar283 + auVar150._28_4_;
    auVar18._4_4_ = fVar190 * fStack_25c;
    auVar18._0_4_ = fVar142 * local_260;
    auVar18._8_4_ = fVar151 * fStack_258;
    auVar18._12_4_ = fVar191 * fStack_254;
    auVar18._16_4_ = fVar152 * fStack_250;
    auVar18._20_4_ = fVar192 * fStack_24c;
    auVar18._24_4_ = fVar153 * fStack_248;
    auVar18._28_4_ = fVar283;
    auVar26._4_4_ = fVar208 * fStack_23c;
    auVar26._0_4_ = fVar193 * local_240;
    auVar26._8_4_ = fVar209 * fStack_238;
    auVar26._12_4_ = fVar210 * fStack_234;
    auVar26._16_4_ = fVar259 * fStack_230;
    auVar26._20_4_ = fVar260 * fStack_22c;
    auVar26._24_4_ = fVar261 * fStack_228;
    auVar26._28_4_ = fVar283 + auVar150._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar26);
    local_600._0_4_ = auVar20._0_4_;
    local_600._4_4_ = auVar20._4_4_;
    fStack_5f8 = auVar20._8_4_;
    fStack_5f4 = auVar20._12_4_;
    fStack_5f0 = auVar20._16_4_;
    fStack_5ec = auVar20._20_4_;
    fStack_5e8 = auVar20._24_4_;
    auVar27._4_4_ = fVar190 * (float)local_600._4_4_;
    auVar27._0_4_ = fVar142 * (float)local_600._0_4_;
    auVar27._8_4_ = fVar151 * fStack_5f8;
    auVar27._12_4_ = fVar191 * fStack_5f4;
    auVar27._16_4_ = fVar152 * fStack_5f0;
    auVar27._20_4_ = fVar192 * fStack_5ec;
    auVar27._24_4_ = fVar153 * fStack_5e8;
    auVar27._28_4_ = fVar283;
    local_6a0._0_4_ = auVar82._0_4_;
    local_6a0._4_4_ = auVar82._4_4_;
    fStack_698 = auVar82._8_4_;
    fStack_694 = auVar82._12_4_;
    fStack_690 = auVar82._16_4_;
    fStack_68c = auVar82._20_4_;
    fStack_688 = auVar82._24_4_;
    auVar28._4_4_ = fVar208 * (float)local_6a0._4_4_;
    auVar28._0_4_ = fVar193 * (float)local_6a0._0_4_;
    auVar28._8_4_ = fVar209 * fStack_698;
    auVar28._12_4_ = fVar210 * fStack_694;
    auVar28._16_4_ = fVar259 * fStack_690;
    auVar28._20_4_ = fVar260 * fStack_68c;
    auVar28._24_4_ = fVar261 * fStack_688;
    auVar28._28_4_ = local_200._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_220._4_4_ * fVar190;
    auVar29._0_4_ = local_220._0_4_ * fVar142;
    auVar29._8_4_ = local_220._8_4_ * fVar151;
    auVar29._12_4_ = local_220._12_4_ * fVar191;
    auVar29._16_4_ = local_220._16_4_ * fVar152;
    auVar29._20_4_ = local_220._20_4_ * fVar192;
    auVar29._24_4_ = local_220._24_4_ * fVar153;
    auVar29._28_4_ = fVar283;
    auVar30._4_4_ = local_560._4_4_ * fVar208;
    auVar30._0_4_ = local_560._0_4_ * fVar193;
    auVar30._8_4_ = local_560._8_4_ * fVar209;
    auVar30._12_4_ = local_560._12_4_ * fVar210;
    auVar30._16_4_ = local_560._16_4_ * fVar259;
    auVar30._20_4_ = local_560._20_4_ * fVar260;
    auVar30._24_4_ = local_560._24_4_ * fVar261;
    auVar30._28_4_ = local_220._28_4_;
    local_5e0 = auVar19._0_4_;
    fStack_5dc = auVar19._4_4_;
    fStack_5d8 = auVar19._8_4_;
    fStack_5d4 = auVar19._12_4_;
    fStack_5d0 = auVar19._16_4_;
    fStack_5cc = auVar19._20_4_;
    fStack_5c8 = auVar19._24_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar245._4_4_ * fVar190;
    auVar31._0_4_ = auVar245._0_4_ * fVar142;
    auVar31._8_4_ = auVar245._8_4_ * fVar151;
    auVar31._12_4_ = auVar245._12_4_ * fVar191;
    auVar31._16_4_ = auVar245._16_4_ * fVar152;
    auVar31._20_4_ = auVar245._20_4_ * fVar192;
    auVar31._24_4_ = auVar245._24_4_ * fVar153;
    auVar31._28_4_ = fVar283;
    auVar32._4_4_ = fVar208 * auVar221._4_4_;
    auVar32._0_4_ = fVar193 * auVar221._0_4_;
    auVar32._8_4_ = fVar209 * auVar221._8_4_;
    auVar32._12_4_ = fVar210 * auVar221._12_4_;
    auVar32._16_4_ = fVar259 * auVar221._16_4_;
    auVar32._20_4_ = fVar260 * auVar221._20_4_;
    auVar32._24_4_ = fVar261 * auVar221._24_4_;
    auVar32._28_4_ = fStack_224;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_280 = auVar221._0_4_ + local_280;
    fStack_27c = auVar221._4_4_ + fStack_27c;
    fStack_278 = auVar221._8_4_ + fStack_278;
    fStack_274 = auVar221._12_4_ + fStack_274;
    fStack_270 = auVar221._16_4_ + fStack_270;
    fStack_26c = auVar221._20_4_ + fStack_26c;
    fStack_268 = auVar221._24_4_ + fStack_268;
    fStack_264 = auVar221._28_4_ + auVar21._28_4_;
    local_2a0 = auVar245._0_4_ + local_2a0;
    fStack_29c = auVar245._4_4_ + fStack_29c;
    fStack_298 = auVar245._8_4_ + fStack_298;
    fStack_294 = auVar245._12_4_ + fStack_294;
    fStack_290 = auVar245._16_4_ + fStack_290;
    fStack_28c = auVar245._20_4_ + fStack_28c;
    fStack_288 = auVar245._24_4_ + fStack_288;
    fStack_284 = auVar245._28_4_ + auVar189._28_4_;
    auVar21._4_4_ = fVar190 * fStack_29c;
    auVar21._0_4_ = fVar142 * local_2a0;
    auVar21._8_4_ = fVar151 * fStack_298;
    auVar21._12_4_ = fVar191 * fStack_294;
    auVar21._16_4_ = fVar152 * fStack_290;
    auVar21._20_4_ = fVar192 * fStack_28c;
    auVar21._24_4_ = fVar153 * fStack_288;
    auVar21._28_4_ = auVar245._28_4_ + auVar189._28_4_;
    auVar33._4_4_ = fStack_27c * fVar208;
    auVar33._0_4_ = local_280 * fVar193;
    auVar33._8_4_ = fStack_278 * fVar209;
    auVar33._12_4_ = fStack_274 * fVar210;
    auVar33._16_4_ = fStack_270 * fVar259;
    auVar33._20_4_ = fStack_26c * fVar260;
    auVar33._24_4_ = fStack_268 * fVar261;
    auVar33._28_4_ = fStack_264;
    auVar21 = vsubps_avx(auVar21,auVar33);
    auVar34._4_4_ = fVar190 * auVar22._4_4_;
    auVar34._0_4_ = fVar142 * auVar22._0_4_;
    auVar34._8_4_ = fVar151 * auVar22._8_4_;
    auVar34._12_4_ = fVar191 * auVar22._12_4_;
    auVar34._16_4_ = fVar152 * auVar22._16_4_;
    auVar34._20_4_ = fVar192 * auVar22._20_4_;
    auVar34._24_4_ = fVar153 * auVar22._24_4_;
    auVar34._28_4_ = fStack_264;
    auVar35._4_4_ = fVar208 * fStack_5dc;
    auVar35._0_4_ = fVar193 * local_5e0;
    auVar35._8_4_ = fVar209 * fStack_5d8;
    auVar35._12_4_ = fVar210 * fStack_5d4;
    auVar35._16_4_ = fVar259 * fStack_5d0;
    auVar35._20_4_ = fVar260 * fStack_5cc;
    auVar35._24_4_ = fVar261 * fStack_5c8;
    auVar35._28_4_ = auVar22._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = fVar190 * local_1e0._4_4_;
    auVar36._0_4_ = fVar142 * local_1e0._0_4_;
    auVar36._8_4_ = fVar151 * local_1e0._8_4_;
    auVar36._12_4_ = fVar191 * local_1e0._12_4_;
    auVar36._16_4_ = fVar152 * local_1e0._16_4_;
    auVar36._20_4_ = fVar192 * local_1e0._20_4_;
    auVar36._24_4_ = fVar153 * local_1e0._24_4_;
    auVar36._28_4_ = auVar84._28_4_ + auVar23._28_4_;
    auVar23._4_4_ = auVar83._4_4_ * fVar208;
    auVar23._0_4_ = auVar83._0_4_ * fVar193;
    auVar23._8_4_ = auVar83._8_4_ * fVar209;
    auVar23._12_4_ = auVar83._12_4_ * fVar210;
    auVar23._16_4_ = auVar83._16_4_ * fVar259;
    auVar23._20_4_ = auVar83._20_4_ * fVar260;
    auVar23._24_4_ = auVar83._24_4_ * fVar261;
    auVar23._28_4_ = auVar85._28_4_ + auVar17._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar19 = vminps_avx(auVar24,auVar18);
    auVar82 = vmaxps_avx(auVar24,auVar18);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar25,auVar26);
    auVar82 = vmaxps_avx(auVar82,auVar19);
    auVar17 = vminps_avx(auVar27,auVar21);
    auVar19 = vmaxps_avx(auVar27,auVar21);
    auVar18 = vminps_avx(auVar28,auVar23);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar28,auVar23);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar82,auVar19);
    auVar82 = vcmpps_avx(auVar18,local_1c0,2);
    auVar19 = vcmpps_avx(auVar19,local_340,5);
    auVar82 = vandps_avx(auVar19,auVar82);
    auVar19 = local_2c0 & auVar82;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(_local_560,local_200);
      auVar20 = vsubps_avx(auVar83,auVar221);
      fVar190 = auVar19._0_4_ + auVar20._0_4_;
      fVar151 = auVar19._4_4_ + auVar20._4_4_;
      fVar191 = auVar19._8_4_ + auVar20._8_4_;
      fVar152 = auVar19._12_4_ + auVar20._12_4_;
      fVar192 = auVar19._16_4_ + auVar20._16_4_;
      fVar153 = auVar19._20_4_ + auVar20._20_4_;
      fVar193 = auVar19._24_4_ + auVar20._24_4_;
      auVar18 = vsubps_avx(local_220,auVar150);
      auVar21 = vsubps_avx(local_1e0,auVar245);
      fVar208 = auVar18._0_4_ + auVar21._0_4_;
      fVar209 = auVar18._4_4_ + auVar21._4_4_;
      fVar210 = auVar18._8_4_ + auVar21._8_4_;
      fVar259 = auVar18._12_4_ + auVar21._12_4_;
      fVar260 = auVar18._16_4_ + auVar21._16_4_;
      fVar261 = auVar18._20_4_ + auVar21._20_4_;
      fVar270 = auVar18._24_4_ + auVar21._24_4_;
      fVar142 = auVar21._28_4_;
      auVar37._4_4_ = auVar150._4_4_ * fVar151;
      auVar37._0_4_ = auVar150._0_4_ * fVar190;
      auVar37._8_4_ = auVar150._8_4_ * fVar191;
      auVar37._12_4_ = auVar150._12_4_ * fVar152;
      auVar37._16_4_ = auVar150._16_4_ * fVar192;
      auVar37._20_4_ = auVar150._20_4_ * fVar153;
      auVar37._24_4_ = auVar150._24_4_ * fVar193;
      auVar37._28_4_ = auVar150._28_4_;
      auVar38._4_4_ = local_200._4_4_ * fVar209;
      auVar38._0_4_ = local_200._0_4_ * fVar208;
      auVar38._8_4_ = local_200._8_4_ * fVar210;
      auVar38._12_4_ = local_200._12_4_ * fVar259;
      auVar38._16_4_ = local_200._16_4_ * fVar260;
      auVar38._20_4_ = local_200._20_4_ * fVar261;
      auVar38._24_4_ = local_200._24_4_ * fVar270;
      auVar38._28_4_ = local_200._28_4_;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar151 * fStack_25c;
      auVar39._0_4_ = fVar190 * local_260;
      auVar39._8_4_ = fVar191 * fStack_258;
      auVar39._12_4_ = fVar152 * fStack_254;
      auVar39._16_4_ = fVar192 * fStack_250;
      auVar39._20_4_ = fVar153 * fStack_24c;
      auVar39._24_4_ = fVar193 * fStack_248;
      auVar39._28_4_ = auVar150._28_4_;
      auVar40._4_4_ = fVar209 * fStack_23c;
      auVar40._0_4_ = fVar208 * local_240;
      auVar40._8_4_ = fVar210 * fStack_238;
      auVar40._12_4_ = fVar259 * fStack_234;
      auVar40._16_4_ = fVar260 * fStack_230;
      auVar40._20_4_ = fVar261 * fStack_22c;
      auVar40._24_4_ = fVar270 * fStack_228;
      auVar40._28_4_ = fVar142;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar151 * (float)local_600._4_4_;
      auVar41._0_4_ = fVar190 * (float)local_600._0_4_;
      auVar41._8_4_ = fVar191 * fStack_5f8;
      auVar41._12_4_ = fVar152 * fStack_5f4;
      auVar41._16_4_ = fVar192 * fStack_5f0;
      auVar41._20_4_ = fVar153 * fStack_5ec;
      auVar41._24_4_ = fVar193 * fStack_5e8;
      auVar41._28_4_ = fVar142;
      auVar42._4_4_ = fVar209 * (float)local_6a0._4_4_;
      auVar42._0_4_ = fVar208 * (float)local_6a0._0_4_;
      auVar42._8_4_ = fVar210 * fStack_698;
      auVar42._12_4_ = fVar259 * fStack_694;
      auVar42._16_4_ = fVar260 * fStack_690;
      auVar42._20_4_ = fVar261 * fStack_68c;
      auVar42._24_4_ = fVar270 * fStack_688;
      auVar42._28_4_ = auVar17._28_4_;
      auVar84 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_220._4_4_ * fVar151;
      auVar43._0_4_ = local_220._0_4_ * fVar190;
      auVar43._8_4_ = local_220._8_4_ * fVar191;
      auVar43._12_4_ = local_220._12_4_ * fVar152;
      auVar43._16_4_ = local_220._16_4_ * fVar192;
      auVar43._20_4_ = local_220._20_4_ * fVar153;
      auVar43._24_4_ = local_220._24_4_ * fVar193;
      auVar43._28_4_ = auVar17._28_4_;
      auVar44._4_4_ = local_560._4_4_ * fVar209;
      auVar44._0_4_ = local_560._0_4_ * fVar208;
      auVar44._8_4_ = local_560._8_4_ * fVar210;
      auVar44._12_4_ = local_560._12_4_ * fVar259;
      auVar44._16_4_ = local_560._16_4_ * fVar260;
      auVar44._20_4_ = local_560._20_4_ * fVar261;
      uVar6 = local_560._28_4_;
      auVar44._24_4_ = local_560._24_4_ * fVar270;
      auVar44._28_4_ = uVar6;
      auVar85 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar245._4_4_ * fVar151;
      auVar45._0_4_ = auVar245._0_4_ * fVar190;
      auVar45._8_4_ = auVar245._8_4_ * fVar191;
      auVar45._12_4_ = auVar245._12_4_ * fVar152;
      auVar45._16_4_ = auVar245._16_4_ * fVar192;
      auVar45._20_4_ = auVar245._20_4_ * fVar153;
      auVar45._24_4_ = auVar245._24_4_ * fVar193;
      auVar45._28_4_ = uVar6;
      auVar46._4_4_ = auVar221._4_4_ * fVar209;
      auVar46._0_4_ = auVar221._0_4_ * fVar208;
      auVar46._8_4_ = auVar221._8_4_ * fVar210;
      auVar46._12_4_ = auVar221._12_4_ * fVar259;
      auVar46._16_4_ = auVar221._16_4_ * fVar260;
      auVar46._20_4_ = auVar221._20_4_ * fVar261;
      auVar46._24_4_ = auVar221._24_4_ * fVar270;
      auVar46._28_4_ = auVar221._28_4_;
      auVar24 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar151 * fStack_29c;
      auVar47._0_4_ = fVar190 * local_2a0;
      auVar47._8_4_ = fVar191 * fStack_298;
      auVar47._12_4_ = fVar152 * fStack_294;
      auVar47._16_4_ = fVar192 * fStack_290;
      auVar47._20_4_ = fVar153 * fStack_28c;
      auVar47._24_4_ = fVar193 * fStack_288;
      auVar47._28_4_ = uVar6;
      auVar48._4_4_ = fVar209 * fStack_27c;
      auVar48._0_4_ = fVar208 * local_280;
      auVar48._8_4_ = fVar210 * fStack_278;
      auVar48._12_4_ = fVar259 * fStack_274;
      auVar48._16_4_ = fVar260 * fStack_270;
      auVar48._20_4_ = fVar261 * fStack_26c;
      auVar48._24_4_ = fVar270 * fStack_268;
      auVar48._28_4_ = auVar245._28_4_;
      auVar25 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar151 * auVar22._4_4_;
      auVar49._0_4_ = fVar190 * auVar22._0_4_;
      auVar49._8_4_ = fVar191 * auVar22._8_4_;
      auVar49._12_4_ = fVar152 * auVar22._12_4_;
      auVar49._16_4_ = fVar192 * auVar22._16_4_;
      auVar49._20_4_ = fVar153 * auVar22._20_4_;
      auVar49._24_4_ = fVar193 * auVar22._24_4_;
      auVar49._28_4_ = auVar245._28_4_;
      auVar50._4_4_ = fStack_5dc * fVar209;
      auVar50._0_4_ = local_5e0 * fVar208;
      auVar50._8_4_ = fStack_5d8 * fVar210;
      auVar50._12_4_ = fStack_5d4 * fVar259;
      auVar50._16_4_ = fStack_5d0 * fVar260;
      auVar50._20_4_ = fStack_5cc * fVar261;
      auVar50._24_4_ = fStack_5c8 * fVar270;
      auVar50._28_4_ = local_220._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_1e0._4_4_ * fVar151;
      auVar51._0_4_ = local_1e0._0_4_ * fVar190;
      auVar51._8_4_ = local_1e0._8_4_ * fVar191;
      auVar51._12_4_ = local_1e0._12_4_ * fVar152;
      auVar51._16_4_ = local_1e0._16_4_ * fVar192;
      auVar51._20_4_ = local_1e0._20_4_ * fVar153;
      auVar51._24_4_ = local_1e0._24_4_ * fVar193;
      auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar52._4_4_ = auVar83._4_4_ * fVar209;
      auVar52._0_4_ = auVar83._0_4_ * fVar208;
      auVar52._8_4_ = auVar83._8_4_ * fVar210;
      auVar52._12_4_ = auVar83._12_4_ * fVar259;
      auVar52._16_4_ = auVar83._16_4_ * fVar260;
      auVar52._20_4_ = auVar83._20_4_ * fVar261;
      auVar52._24_4_ = auVar83._24_4_ * fVar270;
      auVar52._28_4_ = auVar18._28_4_ + fVar142;
      auVar26 = vsubps_avx(auVar51,auVar52);
      auVar20 = vminps_avx(auVar21,auVar23);
      auVar19 = vmaxps_avx(auVar21,auVar23);
      auVar17 = vminps_avx(auVar84,auVar85);
      auVar17 = vminps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar84,auVar85);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar18 = vminps_avx(auVar24,auVar25);
      auVar20 = vmaxps_avx(auVar24,auVar25);
      auVar83 = vminps_avx(auVar22,auVar26);
      auVar18 = vminps_avx(auVar18,auVar83);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar26);
      auVar20 = vmaxps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar18,local_1c0,2);
      auVar20 = vcmpps_avx(auVar20,local_340,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar82 = vandps_avx(local_2c0,auVar82);
      auVar20 = auVar82 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar19,auVar82);
        uVar61 = vmovmskps_avx(auVar82);
        if (uVar61 != 0) {
          uVar57 = (ulong)uVar63;
          auStack_4a0[uVar57] = uVar61 & 0xff;
          uVar7 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar57 * 2) = uVar7;
          uVar62 = vmovlps_avx(auVar118);
          auStack_1a0[uVar57] = uVar62;
          uVar63 = uVar63 + 1;
        }
      }
    }
LAB_00e12774:
    do {
      do {
        do {
          do {
            if (uVar63 == 0) {
              if (bVar64) {
                return bVar64;
              }
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar81._4_4_ = uVar6;
              auVar81._0_4_ = uVar6;
              auVar81._8_4_ = uVar6;
              auVar81._12_4_ = uVar6;
              auVar138 = vcmpps_avx(local_410,auVar81,2);
              uVar55 = vmovmskps_avx(auVar138);
              uVar55 = (uint)uVar59 & uVar55;
              if (uVar55 == 0) {
                return bVar64;
              }
              goto LAB_00e118a0;
            }
            uVar57 = (ulong)(uVar63 - 1);
            uVar61 = auStack_4a0[uVar57];
            fVar142 = afStack_320[uVar57 * 2];
            fVar190 = afStack_320[uVar57 * 2 + 1];
            auVar201._8_8_ = 0;
            auVar201._0_8_ = auStack_1a0[uVar57];
            auVar207 = ZEXT1664(auVar201);
            uVar62 = 0;
            if (uVar61 != 0) {
              for (; (uVar61 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
              }
            }
            uVar61 = uVar61 - 1 & uVar61;
            auStack_4a0[uVar57] = uVar61;
            if (uVar61 == 0) {
              uVar63 = uVar63 - 1;
            }
            fVar191 = (float)(uVar62 + 1) * 0.14285715;
            fVar151 = (1.0 - (float)uVar62 * 0.14285715) * fVar142 +
                      fVar190 * (float)uVar62 * 0.14285715;
            fVar142 = (1.0 - fVar191) * fVar142 + fVar190 * fVar191;
            fVar190 = fVar142 - fVar151;
            if (0.16666667 <= fVar190) {
              auVar138 = vinsertps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar142),0x10);
              auVar289 = ZEXT1664(auVar138);
              goto LAB_00e12109;
            }
            auVar138 = vshufps_avx(auVar201,auVar201,0x50);
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar198 = vsubps_avx(auVar94,auVar138);
            fVar193 = auVar138._0_4_;
            fVar208 = auVar138._4_4_;
            fVar209 = auVar138._8_4_;
            fVar210 = auVar138._12_4_;
            fVar191 = auVar198._0_4_;
            fVar152 = auVar198._4_4_;
            fVar192 = auVar198._8_4_;
            fVar153 = auVar198._12_4_;
            auVar123._0_4_ = fVar193 * auVar180._0_4_ + fVar89 * fVar191;
            auVar123._4_4_ = fVar208 * auVar180._4_4_ + fVar115 * fVar152;
            auVar123._8_4_ = fVar209 * auVar180._0_4_ + fVar89 * fVar192;
            auVar123._12_4_ = fVar210 * auVar180._4_4_ + fVar115 * fVar153;
            auVar159._0_4_ = auVar275._0_4_ * fVar193 + fVar90 * fVar191;
            auVar159._4_4_ = auVar275._4_4_ * fVar208 + fVar252 * fVar152;
            auVar159._8_4_ = auVar275._0_4_ * fVar209 + fVar90 * fVar192;
            auVar159._12_4_ = auVar275._4_4_ * fVar210 + fVar252 * fVar153;
            auVar181._0_4_ = auVar254._0_4_ * fVar193 + fVar91 * fVar191;
            auVar181._4_4_ = auVar254._4_4_ * fVar208 + fVar258 * fVar152;
            auVar181._8_4_ = auVar254._0_4_ * fVar209 + fVar91 * fVar192;
            auVar181._12_4_ = auVar254._4_4_ * fVar210 + fVar258 * fVar153;
            auVar68._0_4_ = auVar238._0_4_ * fVar193 + auVar286._0_4_ * fVar191;
            auVar68._4_4_ = auVar238._4_4_ * fVar208 + auVar286._4_4_ * fVar152;
            auVar68._8_4_ = auVar238._0_4_ * fVar209 + auVar286._0_4_ * fVar192;
            auVar68._12_4_ = auVar238._4_4_ * fVar210 + auVar286._4_4_ * fVar153;
            auVar111._16_16_ = auVar123;
            auVar111._0_16_ = auVar123;
            auVar139._16_16_ = auVar159;
            auVar139._0_16_ = auVar159;
            auVar171._16_16_ = auVar181;
            auVar171._0_16_ = auVar181;
            auVar82 = ZEXT2032(CONCAT416(fVar142,ZEXT416((uint)fVar151)));
            auVar82 = vshufps_avx(auVar82,auVar82,0);
            auVar19 = vsubps_avx(auVar139,auVar111);
            fVar191 = auVar82._0_4_;
            fVar152 = auVar82._4_4_;
            fVar192 = auVar82._8_4_;
            fVar153 = auVar82._12_4_;
            fVar193 = auVar82._16_4_;
            fVar208 = auVar82._20_4_;
            fVar209 = auVar82._24_4_;
            auVar112._0_4_ = auVar123._0_4_ + auVar19._0_4_ * fVar191;
            auVar112._4_4_ = auVar123._4_4_ + auVar19._4_4_ * fVar152;
            auVar112._8_4_ = auVar123._8_4_ + auVar19._8_4_ * fVar192;
            auVar112._12_4_ = auVar123._12_4_ + auVar19._12_4_ * fVar153;
            auVar112._16_4_ = auVar123._0_4_ + auVar19._16_4_ * fVar193;
            auVar112._20_4_ = auVar123._4_4_ + auVar19._20_4_ * fVar208;
            auVar112._24_4_ = auVar123._8_4_ + auVar19._24_4_ * fVar209;
            auVar112._28_4_ = auVar123._12_4_ + auVar19._28_4_;
            auVar82 = vsubps_avx(auVar171,auVar139);
            auVar140._0_4_ = auVar159._0_4_ + auVar82._0_4_ * fVar191;
            auVar140._4_4_ = auVar159._4_4_ + auVar82._4_4_ * fVar152;
            auVar140._8_4_ = auVar159._8_4_ + auVar82._8_4_ * fVar192;
            auVar140._12_4_ = auVar159._12_4_ + auVar82._12_4_ * fVar153;
            auVar140._16_4_ = auVar159._0_4_ + auVar82._16_4_ * fVar193;
            auVar140._20_4_ = auVar159._4_4_ + auVar82._20_4_ * fVar208;
            auVar140._24_4_ = auVar159._8_4_ + auVar82._24_4_ * fVar209;
            auVar140._28_4_ = auVar159._12_4_ + auVar82._28_4_;
            auVar138 = vsubps_avx(auVar68,auVar181);
            auVar86._0_4_ = auVar181._0_4_ + auVar138._0_4_ * fVar191;
            auVar86._4_4_ = auVar181._4_4_ + auVar138._4_4_ * fVar152;
            auVar86._8_4_ = auVar181._8_4_ + auVar138._8_4_ * fVar192;
            auVar86._12_4_ = auVar181._12_4_ + auVar138._12_4_ * fVar153;
            auVar86._16_4_ = auVar181._0_4_ + auVar138._0_4_ * fVar193;
            auVar86._20_4_ = auVar181._4_4_ + auVar138._4_4_ * fVar208;
            auVar86._24_4_ = auVar181._8_4_ + auVar138._8_4_ * fVar209;
            auVar86._28_4_ = auVar181._12_4_ + auVar138._12_4_;
            auVar82 = vsubps_avx(auVar140,auVar112);
            auVar113._0_4_ = auVar112._0_4_ + fVar191 * auVar82._0_4_;
            auVar113._4_4_ = auVar112._4_4_ + fVar152 * auVar82._4_4_;
            auVar113._8_4_ = auVar112._8_4_ + fVar192 * auVar82._8_4_;
            auVar113._12_4_ = auVar112._12_4_ + fVar153 * auVar82._12_4_;
            auVar113._16_4_ = auVar112._16_4_ + fVar193 * auVar82._16_4_;
            auVar113._20_4_ = auVar112._20_4_ + fVar208 * auVar82._20_4_;
            auVar113._24_4_ = auVar112._24_4_ + fVar209 * auVar82._24_4_;
            auVar113._28_4_ = auVar112._28_4_ + auVar82._28_4_;
            auVar82 = vsubps_avx(auVar86,auVar140);
            auVar87._0_4_ = auVar140._0_4_ + fVar191 * auVar82._0_4_;
            auVar87._4_4_ = auVar140._4_4_ + fVar152 * auVar82._4_4_;
            auVar87._8_4_ = auVar140._8_4_ + fVar192 * auVar82._8_4_;
            auVar87._12_4_ = auVar140._12_4_ + fVar153 * auVar82._12_4_;
            auVar87._16_4_ = auVar140._16_4_ + fVar193 * auVar82._16_4_;
            auVar87._20_4_ = auVar140._20_4_ + fVar208 * auVar82._20_4_;
            auVar87._24_4_ = auVar140._24_4_ + fVar209 * auVar82._24_4_;
            auVar87._28_4_ = auVar140._28_4_ + auVar82._28_4_;
            auVar82 = vsubps_avx(auVar87,auVar113);
            auVar202._0_4_ = auVar113._0_4_ + fVar191 * auVar82._0_4_;
            auVar202._4_4_ = auVar113._4_4_ + fVar152 * auVar82._4_4_;
            auVar202._8_4_ = auVar113._8_4_ + fVar192 * auVar82._8_4_;
            auVar202._12_4_ = auVar113._12_4_ + fVar153 * auVar82._12_4_;
            auVar206._16_4_ = auVar113._16_4_ + fVar193 * auVar82._16_4_;
            auVar206._0_16_ = auVar202;
            auVar206._20_4_ = auVar113._20_4_ + fVar208 * auVar82._20_4_;
            auVar206._24_4_ = auVar113._24_4_ + fVar209 * auVar82._24_4_;
            auVar206._28_4_ = auVar113._28_4_ + auVar140._28_4_;
            auVar92 = auVar206._16_16_;
            auVar96 = vshufps_avx(ZEXT416((uint)(fVar190 * 0.33333334)),
                                  ZEXT416((uint)(fVar190 * 0.33333334)),0);
            auVar182._0_4_ = auVar202._0_4_ + auVar96._0_4_ * auVar82._0_4_ * 3.0;
            auVar182._4_4_ = auVar202._4_4_ + auVar96._4_4_ * auVar82._4_4_ * 3.0;
            auVar182._8_4_ = auVar202._8_4_ + auVar96._8_4_ * auVar82._8_4_ * 3.0;
            auVar182._12_4_ = auVar202._12_4_ + auVar96._12_4_ * auVar82._12_4_ * 3.0;
            auVar136 = vshufpd_avx(auVar202,auVar202,3);
            auVar66 = vshufpd_avx(auVar92,auVar92,3);
            _local_560 = auVar136;
            auVar138 = vsubps_avx(auVar136,auVar202);
            auVar198 = vsubps_avx(auVar66,auVar92);
            auVar69._0_4_ = auVar138._0_4_ + auVar198._0_4_;
            auVar69._4_4_ = auVar138._4_4_ + auVar198._4_4_;
            auVar69._8_4_ = auVar138._8_4_ + auVar198._8_4_;
            auVar69._12_4_ = auVar138._12_4_ + auVar198._12_4_;
            auVar138 = vmovshdup_avx(auVar202);
            auVar198 = vmovshdup_avx(auVar182);
            auVar126 = vshufps_avx(auVar69,auVar69,0);
            auVar65 = vshufps_avx(auVar69,auVar69,0x55);
            fVar191 = auVar65._0_4_;
            fVar152 = auVar65._4_4_;
            fVar192 = auVar65._8_4_;
            fVar153 = auVar65._12_4_;
            fVar193 = auVar126._0_4_;
            fVar208 = auVar126._4_4_;
            fVar209 = auVar126._8_4_;
            fVar210 = auVar126._12_4_;
            auVar70._0_4_ = fVar193 * auVar202._0_4_ + auVar138._0_4_ * fVar191;
            auVar70._4_4_ = fVar208 * auVar202._4_4_ + auVar138._4_4_ * fVar152;
            auVar70._8_4_ = fVar209 * auVar202._8_4_ + auVar138._8_4_ * fVar192;
            auVar70._12_4_ = fVar210 * auVar202._12_4_ + auVar138._12_4_ * fVar153;
            auVar124._0_4_ = fVar193 * auVar182._0_4_ + auVar198._0_4_ * fVar191;
            auVar124._4_4_ = fVar208 * auVar182._4_4_ + auVar198._4_4_ * fVar152;
            auVar124._8_4_ = fVar209 * auVar182._8_4_ + auVar198._8_4_ * fVar192;
            auVar124._12_4_ = fVar210 * auVar182._12_4_ + auVar198._12_4_ * fVar153;
            auVar198 = vshufps_avx(auVar70,auVar70,0xe8);
            auVar126 = vshufps_avx(auVar124,auVar124,0xe8);
            auVar138 = vcmpps_avx(auVar198,auVar126,1);
            uVar61 = vextractps_avx(auVar138,0);
            auVar65 = auVar124;
            if ((uVar61 & 1) == 0) {
              auVar65 = auVar70;
            }
            auVar95._0_4_ = auVar96._0_4_ * auVar82._16_4_ * 3.0;
            auVar95._4_4_ = auVar96._4_4_ * auVar82._20_4_ * 3.0;
            auVar95._8_4_ = auVar96._8_4_ * auVar82._24_4_ * 3.0;
            auVar95._12_4_ = auVar96._12_4_ * 0.0;
            auVar116 = vsubps_avx(auVar92,auVar95);
            auVar96 = vmovshdup_avx(auVar116);
            auVar92 = vmovshdup_avx(auVar92);
            fVar259 = auVar116._0_4_;
            fVar260 = auVar116._4_4_;
            auVar160._0_4_ = fVar259 * fVar193 + auVar96._0_4_ * fVar191;
            auVar160._4_4_ = fVar260 * fVar208 + auVar96._4_4_ * fVar152;
            auVar160._8_4_ = auVar116._8_4_ * fVar209 + auVar96._8_4_ * fVar192;
            auVar160._12_4_ = auVar116._12_4_ * fVar210 + auVar96._12_4_ * fVar153;
            auVar183._0_4_ = fVar193 * auVar206._16_4_ + auVar92._0_4_ * fVar191;
            auVar183._4_4_ = fVar208 * auVar206._20_4_ + auVar92._4_4_ * fVar152;
            auVar183._8_4_ = fVar209 * auVar206._24_4_ + auVar92._8_4_ * fVar192;
            auVar183._12_4_ = fVar210 * auVar206._28_4_ + auVar92._12_4_ * fVar153;
            auVar92 = vshufps_avx(auVar160,auVar160,0xe8);
            auVar117 = vshufps_avx(auVar183,auVar183,0xe8);
            auVar96 = vcmpps_avx(auVar92,auVar117,1);
            uVar61 = vextractps_avx(auVar96,0);
            auVar118 = auVar183;
            if ((uVar61 & 1) == 0) {
              auVar118 = auVar160;
            }
            auVar65 = vmaxss_avx(auVar118,auVar65);
            auVar198 = vminps_avx(auVar198,auVar126);
            auVar126 = vminps_avx(auVar92,auVar117);
            auVar126 = vminps_avx(auVar198,auVar126);
            auVar138 = vshufps_avx(auVar138,auVar138,0x55);
            auVar138 = vblendps_avx(auVar138,auVar96,2);
            auVar96 = vpslld_avx(auVar138,0x1f);
            auVar138 = vshufpd_avx(auVar124,auVar124,1);
            auVar138 = vinsertps_avx(auVar138,auVar183,0x9c);
            auVar198 = vshufpd_avx(auVar70,auVar70,1);
            auVar198 = vinsertps_avx(auVar198,auVar160,0x9c);
            auVar138 = vblendvps_avx(auVar198,auVar138,auVar96);
            auVar198 = vmovshdup_avx(auVar138);
            auVar138 = vmaxss_avx(auVar198,auVar138);
            fVar192 = auVar126._0_4_;
            auVar198 = vmovshdup_avx(auVar126);
            fVar152 = auVar138._0_4_;
            fVar153 = auVar198._0_4_;
            fVar191 = auVar65._0_4_;
            if ((fVar192 < 0.0001) && (-0.0001 < fVar152)) break;
            if ((fVar153 < 0.0001 && -0.0001 < fVar191) || (fVar192 < 0.0001 && -0.0001 < fVar191))
            break;
            auVar96 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar138,1);
            auVar198 = vcmpps_avx(auVar198,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar198 = vandps_avx(auVar198,auVar96);
          } while ((auVar198 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar96 = vcmpps_avx(auVar126,_DAT_01f7aa10,1);
          auVar198 = vcmpss_avx(auVar65,ZEXT416(0),1);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar161._8_4_ = 0xbf800000;
          auVar161._0_8_ = 0xbf800000bf800000;
          auVar161._12_4_ = 0xbf800000;
          auVar198 = vblendvps_avx(auVar125,auVar161,auVar198);
          auVar96 = vblendvps_avx(auVar125,auVar161,auVar96);
          auVar126 = vcmpss_avx(auVar96,auVar198,4);
          auVar126 = vpshufd_avx(ZEXT416(auVar126._0_4_ & 1),0x50);
          auVar126 = vpslld_avx(auVar126,0x1f);
          auVar126 = vpsrad_avx(auVar126,0x1f);
          auVar126 = vpandn_avx(auVar126,_DAT_01fafeb0);
          auVar65 = vmovshdup_avx(auVar96);
          fVar193 = auVar65._0_4_;
          local_640._0_4_ = auVar15._0_4_;
          local_640._4_4_ = auVar15._4_4_;
          fStack_638 = auVar15._8_4_;
          fStack_634 = auVar15._12_4_;
          if ((auVar96._0_4_ != fVar193) || (NAN(auVar96._0_4_) || NAN(fVar193))) {
            if ((fVar153 != fVar192) || (NAN(fVar153) || NAN(fVar192))) {
              fVar192 = -fVar192 / (fVar153 - fVar192);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar192) * 0.0 + fVar192)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar192 != 0.0) || (NAN(fVar192))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar92 = vcmpps_avx(auVar126,auVar96,1);
            auVar65 = vblendps_avx(auVar126,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar126,2);
            auVar126 = vblendvps_avx(auVar96,auVar65,auVar92);
          }
          auVar138 = vcmpss_avx(auVar138,ZEXT416(0),1);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar162._8_4_ = 0xbf800000;
          auVar162._0_8_ = 0xbf800000bf800000;
          auVar162._12_4_ = 0xbf800000;
          auVar138 = vblendvps_avx(auVar127,auVar162,auVar138);
          fVar192 = auVar138._0_4_;
          if ((auVar198._0_4_ != fVar192) || (NAN(auVar198._0_4_) || NAN(fVar192))) {
            if ((fVar152 != fVar191) || (NAN(fVar152) || NAN(fVar191))) {
              fVar191 = -fVar191 / (fVar152 - fVar191);
              auVar138 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar191) * 0.0 + fVar191)));
            }
            else {
              auVar138 = ZEXT816(0x3f80000000000000);
              if ((fVar191 != 0.0) || (NAN(fVar191))) {
                auVar138 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar96 = vcmpps_avx(auVar126,auVar138,1);
            auVar198 = vblendps_avx(auVar126,auVar138,2);
            auVar138 = vblendps_avx(auVar138,auVar126,2);
            auVar126 = vblendvps_avx(auVar138,auVar198,auVar96);
          }
          if ((fVar193 != fVar192) || (NAN(fVar193) || NAN(fVar192))) {
            auVar71._8_4_ = 0x3f800000;
            auVar71._0_8_ = 0x3f8000003f800000;
            auVar71._12_4_ = 0x3f800000;
            auVar138 = vcmpps_avx(auVar126,auVar71,1);
            auVar198 = vinsertps_avx(auVar126,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar128._4_12_ = auVar126._4_12_;
            auVar128._0_4_ = 0x3f800000;
            auVar126 = vblendvps_avx(auVar128,auVar198,auVar138);
          }
          auVar138 = vcmpps_avx(auVar126,_DAT_01f7b6f0,1);
          auVar53._12_4_ = 0;
          auVar53._0_12_ = auVar126._4_12_;
          auVar198 = vinsertps_avx(auVar126,ZEXT416(0x3f800000),0x10);
          auVar138 = vblendvps_avx(auVar198,auVar53 << 0x20,auVar138);
          auVar198 = vmovshdup_avx(auVar138);
        } while (auVar198._0_4_ < auVar138._0_4_);
        auVar72._0_4_ = auVar138._0_4_ + -0.1;
        auVar72._4_4_ = auVar138._4_4_ + 0.1;
        auVar72._8_4_ = auVar138._8_4_ + 0.0;
        auVar72._12_4_ = auVar138._12_4_ + 0.0;
        auVar96 = vshufpd_avx(auVar182,auVar182,3);
        auVar203._8_8_ = 0x3f80000000000000;
        auVar203._0_8_ = 0x3f80000000000000;
        auVar138 = vcmpps_avx(auVar72,auVar203,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar72._4_12_;
        auVar198 = vinsertps_avx(auVar72,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar138 = vblendvps_avx(auVar198,auVar54 << 0x20,auVar138);
        auVar198 = vshufpd_avx(auVar116,auVar116,3);
        auVar126 = vshufps_avx(auVar138,auVar138,0x50);
        auVar204._8_4_ = 0x3f800000;
        auVar204._0_8_ = 0x3f8000003f800000;
        auVar204._12_4_ = 0x3f800000;
        auVar65 = vsubps_avx(auVar204,auVar126);
        local_560._0_4_ = auVar136._0_4_;
        local_560._4_4_ = auVar136._4_4_;
        fStack_558 = auVar136._8_4_;
        fStack_554 = auVar136._12_4_;
        fVar191 = auVar126._0_4_;
        fVar152 = auVar126._4_4_;
        fVar192 = auVar126._8_4_;
        fVar153 = auVar126._12_4_;
        local_620 = auVar66._0_4_;
        fStack_61c = auVar66._4_4_;
        fStack_618 = auVar66._8_4_;
        fStack_614 = auVar66._12_4_;
        fVar193 = auVar65._0_4_;
        fVar208 = auVar65._4_4_;
        fVar209 = auVar65._8_4_;
        fVar210 = auVar65._12_4_;
        auVar73._0_4_ = fVar191 * (float)local_560._0_4_ + fVar193 * auVar202._0_4_;
        auVar73._4_4_ = fVar152 * (float)local_560._4_4_ + fVar208 * auVar202._4_4_;
        auVar73._8_4_ = fVar192 * fStack_558 + fVar209 * auVar202._0_4_;
        auVar73._12_4_ = fVar153 * fStack_554 + fVar210 * auVar202._4_4_;
        auVar129._0_4_ = fVar191 * auVar96._0_4_ + fVar193 * auVar182._0_4_;
        auVar129._4_4_ = fVar152 * auVar96._4_4_ + fVar208 * auVar182._4_4_;
        auVar129._8_4_ = fVar192 * auVar96._8_4_ + fVar209 * auVar182._0_4_;
        auVar129._12_4_ = fVar153 * auVar96._12_4_ + fVar210 * auVar182._4_4_;
        auVar184._0_4_ = fVar191 * auVar198._0_4_ + fVar193 * fVar259;
        auVar184._4_4_ = fVar152 * auVar198._4_4_ + fVar208 * fVar260;
        auVar184._8_4_ = fVar192 * auVar198._8_4_ + fVar209 * fVar259;
        auVar184._12_4_ = fVar153 * auVar198._12_4_ + fVar210 * fVar260;
        auVar220._0_4_ = fVar191 * local_620 + fVar193 * auVar206._16_4_;
        auVar220._4_4_ = fVar152 * fStack_61c + fVar208 * auVar206._20_4_;
        auVar220._8_4_ = fVar192 * fStack_618 + fVar209 * auVar206._16_4_;
        auVar220._12_4_ = fVar153 * fStack_614 + fVar210 * auVar206._20_4_;
        auVar66 = vsubps_avx(auVar204,auVar138);
        auVar198 = vmovshdup_avx(auVar201);
        auVar136 = vmovsldup_avx(auVar201);
        auVar205._0_4_ = auVar136._0_4_ * auVar66._0_4_ + auVar138._0_4_ * auVar198._0_4_;
        auVar205._4_4_ = auVar136._4_4_ * auVar66._4_4_ + auVar138._4_4_ * auVar198._4_4_;
        auVar205._8_4_ = auVar136._8_4_ * auVar66._8_4_ + auVar138._8_4_ * auVar198._8_4_;
        auVar205._12_4_ = auVar136._12_4_ * auVar66._12_4_ + auVar138._12_4_ * auVar198._12_4_;
        auVar116 = vmovshdup_avx(auVar205);
        auVar138 = vsubps_avx(auVar129,auVar73);
        auVar148._0_4_ = auVar138._0_4_ * 3.0;
        auVar148._4_4_ = auVar138._4_4_ * 3.0;
        auVar148._8_4_ = auVar138._8_4_ * 3.0;
        auVar148._12_4_ = auVar138._12_4_ * 3.0;
        auVar138 = vsubps_avx(auVar184,auVar129);
        auVar226._0_4_ = auVar138._0_4_ * 3.0;
        auVar226._4_4_ = auVar138._4_4_ * 3.0;
        auVar226._8_4_ = auVar138._8_4_ * 3.0;
        auVar226._12_4_ = auVar138._12_4_ * 3.0;
        auVar138 = vsubps_avx(auVar220,auVar184);
        auVar239._0_4_ = auVar138._0_4_ * 3.0;
        auVar239._4_4_ = auVar138._4_4_ * 3.0;
        auVar239._8_4_ = auVar138._8_4_ * 3.0;
        auVar239._12_4_ = auVar138._12_4_ * 3.0;
        auVar198 = vminps_avx(auVar226,auVar239);
        auVar138 = vmaxps_avx(auVar226,auVar239);
        auVar198 = vminps_avx(auVar148,auVar198);
        auVar138 = vmaxps_avx(auVar148,auVar138);
        auVar136 = vshufpd_avx(auVar198,auVar198,3);
        auVar66 = vshufpd_avx(auVar138,auVar138,3);
        auVar198 = vminps_avx(auVar198,auVar136);
        auVar138 = vmaxps_avx(auVar138,auVar66);
        auVar136 = vshufps_avx(ZEXT416((uint)(1.0 / fVar190)),ZEXT416((uint)(1.0 / fVar190)),0);
        auVar227._0_4_ = auVar198._0_4_ * auVar136._0_4_;
        auVar227._4_4_ = auVar198._4_4_ * auVar136._4_4_;
        auVar227._8_4_ = auVar198._8_4_ * auVar136._8_4_;
        auVar227._12_4_ = auVar198._12_4_ * auVar136._12_4_;
        auVar240._0_4_ = auVar136._0_4_ * auVar138._0_4_;
        auVar240._4_4_ = auVar136._4_4_ * auVar138._4_4_;
        auVar240._8_4_ = auVar136._8_4_ * auVar138._8_4_;
        auVar240._12_4_ = auVar136._12_4_ * auVar138._12_4_;
        auVar65 = ZEXT416((uint)(1.0 / (auVar116._0_4_ - auVar205._0_4_)));
        auVar138 = vshufpd_avx(auVar73,auVar73,3);
        auVar198 = vshufpd_avx(auVar129,auVar129,3);
        auVar136 = vshufpd_avx(auVar184,auVar184,3);
        auVar66 = vshufpd_avx(auVar220,auVar220,3);
        auVar138 = vsubps_avx(auVar138,auVar73);
        auVar96 = vsubps_avx(auVar198,auVar129);
        auVar126 = vsubps_avx(auVar136,auVar184);
        auVar66 = vsubps_avx(auVar66,auVar220);
        auVar198 = vminps_avx(auVar138,auVar96);
        auVar138 = vmaxps_avx(auVar138,auVar96);
        auVar136 = vminps_avx(auVar126,auVar66);
        auVar136 = vminps_avx(auVar198,auVar136);
        auVar198 = vmaxps_avx(auVar126,auVar66);
        auVar138 = vmaxps_avx(auVar138,auVar198);
        auVar198 = vshufps_avx(auVar65,auVar65,0);
        auVar287._0_4_ = auVar198._0_4_ * auVar136._0_4_;
        auVar287._4_4_ = auVar198._4_4_ * auVar136._4_4_;
        auVar287._8_4_ = auVar198._8_4_ * auVar136._8_4_;
        auVar287._12_4_ = auVar198._12_4_ * auVar136._12_4_;
        auVar296._0_4_ = auVar198._0_4_ * auVar138._0_4_;
        auVar296._4_4_ = auVar198._4_4_ * auVar138._4_4_;
        auVar296._8_4_ = auVar198._8_4_ * auVar138._8_4_;
        auVar296._12_4_ = auVar198._12_4_ * auVar138._12_4_;
        auVar138 = vmovsldup_avx(auVar205);
        auVar255._4_12_ = auVar138._4_12_;
        auVar255._0_4_ = fVar151;
        auVar265._4_12_ = auVar205._4_12_;
        auVar265._0_4_ = fVar142;
        auVar149._0_4_ = (fVar151 + fVar142) * 0.5;
        auVar149._4_4_ = (auVar138._4_4_ + auVar205._4_4_) * 0.5;
        auVar149._8_4_ = (auVar138._8_4_ + auVar205._8_4_) * 0.5;
        auVar149._12_4_ = (auVar138._12_4_ + auVar205._12_4_) * 0.5;
        auVar138 = vshufps_avx(auVar149,auVar149,0);
        fVar191 = auVar138._0_4_;
        fVar152 = auVar138._4_4_;
        fVar192 = auVar138._8_4_;
        fVar153 = auVar138._12_4_;
        auVar97._0_4_ = (float)local_640._0_4_ + fVar191 * (float)local_350._0_4_;
        auVar97._4_4_ = (float)local_640._4_4_ + fVar152 * (float)local_350._4_4_;
        auVar97._8_4_ = fStack_638 + fVar192 * fStack_348;
        auVar97._12_4_ = fStack_634 + fVar153 * fStack_344;
        local_630._0_4_ = auVar264._0_4_;
        local_630._4_4_ = auVar264._4_4_;
        fStack_628 = auVar264._8_4_;
        fStack_624 = auVar264._12_4_;
        auVar130._0_4_ = fVar191 * (float)local_360._0_4_ + (float)local_630._0_4_;
        auVar130._4_4_ = fVar152 * (float)local_360._4_4_ + (float)local_630._4_4_;
        auVar130._8_4_ = fVar192 * fStack_358 + fStack_628;
        auVar130._12_4_ = fVar153 * fStack_354 + fStack_624;
        local_5a0 = auVar16._0_4_;
        fStack_59c = auVar16._4_4_;
        fStack_598 = auVar16._8_4_;
        fStack_594 = auVar16._12_4_;
        auVar185._0_4_ = fVar191 * (float)local_370._0_4_ + local_5a0;
        auVar185._4_4_ = fVar152 * (float)local_370._4_4_ + fStack_59c;
        auVar185._8_4_ = fVar192 * fStack_368 + fStack_598;
        auVar185._12_4_ = fVar153 * fStack_364 + fStack_594;
        auVar138 = vsubps_avx(auVar130,auVar97);
        auVar98._0_4_ = auVar97._0_4_ + fVar191 * auVar138._0_4_;
        auVar98._4_4_ = auVar97._4_4_ + fVar152 * auVar138._4_4_;
        auVar98._8_4_ = auVar97._8_4_ + fVar192 * auVar138._8_4_;
        auVar98._12_4_ = auVar97._12_4_ + fVar153 * auVar138._12_4_;
        auVar138 = vsubps_avx(auVar185,auVar130);
        auVar131._0_4_ = auVar130._0_4_ + fVar191 * auVar138._0_4_;
        auVar131._4_4_ = auVar130._4_4_ + fVar152 * auVar138._4_4_;
        auVar131._8_4_ = auVar130._8_4_ + fVar192 * auVar138._8_4_;
        auVar131._12_4_ = auVar130._12_4_ + fVar153 * auVar138._12_4_;
        auVar138 = vsubps_avx(auVar131,auVar98);
        fVar191 = auVar98._0_4_ + fVar191 * auVar138._0_4_;
        fVar152 = auVar98._4_4_ + fVar152 * auVar138._4_4_;
        auVar74._0_8_ = CONCAT44(fVar152,fVar191);
        auVar74._8_4_ = auVar98._8_4_ + fVar192 * auVar138._8_4_;
        auVar74._12_4_ = auVar98._12_4_ + fVar153 * auVar138._12_4_;
        fVar192 = auVar138._0_4_ * 3.0;
        fVar153 = auVar138._4_4_ * 3.0;
        auVar99._0_8_ = CONCAT44(fVar153,fVar192);
        auVar99._8_4_ = auVar138._8_4_ * 3.0;
        auVar99._12_4_ = auVar138._12_4_ * 3.0;
        auVar132._8_8_ = auVar74._0_8_;
        auVar132._0_8_ = auVar74._0_8_;
        auVar138 = vshufpd_avx(auVar74,auVar74,3);
        auVar198 = vshufps_avx(auVar149,auVar149,0x55);
        auVar126 = vsubps_avx(auVar138,auVar132);
        auVar276._0_4_ = auVar126._0_4_ * auVar198._0_4_ + fVar191;
        auVar276._4_4_ = auVar126._4_4_ * auVar198._4_4_ + fVar152;
        auVar276._8_4_ = auVar126._8_4_ * auVar198._8_4_ + fVar191;
        auVar276._12_4_ = auVar126._12_4_ * auVar198._12_4_ + fVar152;
        auVar133._8_8_ = auVar99._0_8_;
        auVar133._0_8_ = auVar99._0_8_;
        auVar138 = vshufpd_avx(auVar99,auVar99,1);
        auVar138 = vsubps_avx(auVar138,auVar133);
        auVar100._0_4_ = auVar138._0_4_ * auVar198._0_4_ + fVar192;
        auVar100._4_4_ = auVar138._4_4_ * auVar198._4_4_ + fVar153;
        auVar100._8_4_ = auVar138._8_4_ * auVar198._8_4_ + fVar192;
        auVar100._12_4_ = auVar138._12_4_ * auVar198._12_4_ + fVar153;
        auVar198 = vmovshdup_avx(auVar100);
        auVar186._0_8_ = auVar198._0_8_ ^ 0x8000000080000000;
        auVar186._8_4_ = auVar198._8_4_ ^ 0x80000000;
        auVar186._12_4_ = auVar198._12_4_ ^ 0x80000000;
        auVar136 = vmovshdup_avx(auVar126);
        auVar138 = vunpcklps_avx(auVar136,auVar186);
        auVar66 = vshufps_avx(auVar138,auVar186,4);
        auVar75._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
        auVar75._8_4_ = -auVar126._8_4_;
        auVar75._12_4_ = -auVar126._12_4_;
        auVar138 = vmovlhps_avx(auVar75,auVar100);
        auVar96 = vshufps_avx(auVar138,auVar100,8);
        auVar138 = ZEXT416((uint)(auVar100._0_4_ * auVar136._0_4_ - auVar126._0_4_ * auVar198._0_4_)
                          );
        auVar198 = vshufps_avx(auVar138,auVar138,0);
        auVar138 = vdivps_avx(auVar66,auVar198);
        auVar198 = vdivps_avx(auVar96,auVar198);
        auVar96 = vinsertps_avx(auVar227,auVar287,0x1c);
        auVar126 = vinsertps_avx(auVar240,auVar296,0x1c);
        auVar65 = vinsertps_avx(auVar287,auVar227,0x4c);
        auVar92 = vinsertps_avx(auVar296,auVar240,0x4c);
        auVar136 = vmovsldup_avx(auVar138);
        auVar241._0_4_ = auVar96._0_4_ * auVar136._0_4_;
        auVar241._4_4_ = auVar96._4_4_ * auVar136._4_4_;
        auVar241._8_4_ = auVar96._8_4_ * auVar136._8_4_;
        auVar241._12_4_ = auVar96._12_4_ * auVar136._12_4_;
        auVar101._0_4_ = auVar136._0_4_ * auVar126._0_4_;
        auVar101._4_4_ = auVar136._4_4_ * auVar126._4_4_;
        auVar101._8_4_ = auVar136._8_4_ * auVar126._8_4_;
        auVar101._12_4_ = auVar136._12_4_ * auVar126._12_4_;
        auVar66 = vminps_avx(auVar241,auVar101);
        auVar136 = vmaxps_avx(auVar101,auVar241);
        auVar117 = vmovsldup_avx(auVar198);
        auVar297._0_4_ = auVar117._0_4_ * auVar65._0_4_;
        auVar297._4_4_ = auVar117._4_4_ * auVar65._4_4_;
        auVar297._8_4_ = auVar117._8_4_ * auVar65._8_4_;
        auVar297._12_4_ = auVar117._12_4_ * auVar65._12_4_;
        auVar242._0_4_ = auVar117._0_4_ * auVar92._0_4_;
        auVar242._4_4_ = auVar117._4_4_ * auVar92._4_4_;
        auVar242._8_4_ = auVar117._8_4_ * auVar92._8_4_;
        auVar242._12_4_ = auVar117._12_4_ * auVar92._12_4_;
        auVar117 = vminps_avx(auVar297,auVar242);
        auVar163._0_4_ = auVar66._0_4_ + auVar117._0_4_;
        auVar163._4_4_ = auVar66._4_4_ + auVar117._4_4_;
        auVar163._8_4_ = auVar66._8_4_ + auVar117._8_4_;
        auVar163._12_4_ = auVar66._12_4_ + auVar117._12_4_;
        auVar66 = vmaxps_avx(auVar242,auVar297);
        auVar117 = vsubps_avx(auVar255,auVar149);
        auVar118 = vsubps_avx(auVar265,auVar149);
        auVar102._0_4_ = auVar66._0_4_ + auVar136._0_4_;
        auVar102._4_4_ = auVar66._4_4_ + auVar136._4_4_;
        auVar102._8_4_ = auVar66._8_4_ + auVar136._8_4_;
        auVar102._12_4_ = auVar66._12_4_ + auVar136._12_4_;
        auVar266._8_8_ = 0x3f800000;
        auVar266._0_8_ = 0x3f800000;
        auVar136 = vsubps_avx(auVar266,auVar102);
        auVar66 = vsubps_avx(auVar266,auVar163);
        fVar209 = auVar117._0_4_;
        auVar267._0_4_ = fVar209 * auVar136._0_4_;
        fVar210 = auVar117._4_4_;
        auVar267._4_4_ = fVar210 * auVar136._4_4_;
        fVar259 = auVar117._8_4_;
        auVar267._8_4_ = fVar259 * auVar136._8_4_;
        fVar260 = auVar117._12_4_;
        auVar267._12_4_ = fVar260 * auVar136._12_4_;
        fVar192 = auVar118._0_4_;
        auVar103._0_4_ = fVar192 * auVar136._0_4_;
        fVar153 = auVar118._4_4_;
        auVar103._4_4_ = fVar153 * auVar136._4_4_;
        fVar193 = auVar118._8_4_;
        auVar103._8_4_ = fVar193 * auVar136._8_4_;
        fVar208 = auVar118._12_4_;
        auVar103._12_4_ = fVar208 * auVar136._12_4_;
        auVar288._0_4_ = fVar209 * auVar66._0_4_;
        auVar288._4_4_ = fVar210 * auVar66._4_4_;
        auVar288._8_4_ = fVar259 * auVar66._8_4_;
        auVar288._12_4_ = fVar260 * auVar66._12_4_;
        auVar164._0_4_ = fVar192 * auVar66._0_4_;
        auVar164._4_4_ = fVar153 * auVar66._4_4_;
        auVar164._8_4_ = fVar193 * auVar66._8_4_;
        auVar164._12_4_ = fVar208 * auVar66._12_4_;
        auVar136 = vminps_avx(auVar267,auVar288);
        auVar66 = vminps_avx(auVar103,auVar164);
        auVar117 = vminps_avx(auVar136,auVar66);
        auVar136 = vmaxps_avx(auVar288,auVar267);
        auVar66 = vmaxps_avx(auVar164,auVar103);
        auVar118 = vshufps_avx(auVar149,auVar149,0x54);
        auVar66 = vmaxps_avx(auVar66,auVar136);
        auVar119 = vshufps_avx(auVar276,auVar276,0);
        auVar143 = vshufps_avx(auVar276,auVar276,0x55);
        auVar136 = vhaddps_avx(auVar117,auVar117);
        auVar66 = vhaddps_avx(auVar66,auVar66);
        auVar165._0_4_ = auVar143._0_4_ * auVar198._0_4_ + auVar119._0_4_ * auVar138._0_4_;
        auVar165._4_4_ = auVar143._4_4_ * auVar198._4_4_ + auVar119._4_4_ * auVar138._4_4_;
        auVar165._8_4_ = auVar143._8_4_ * auVar198._8_4_ + auVar119._8_4_ * auVar138._8_4_;
        auVar165._12_4_ = auVar143._12_4_ * auVar198._12_4_ + auVar119._12_4_ * auVar138._12_4_;
        auVar117 = vsubps_avx(auVar118,auVar165);
        fVar191 = auVar117._0_4_ + auVar136._0_4_;
        fVar152 = auVar117._0_4_ + auVar66._0_4_;
        auVar136 = vmaxss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar191));
        auVar66 = vminss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar142));
      } while (auVar66._0_4_ < auVar136._0_4_);
      auVar136 = vmovshdup_avx(auVar138);
      auVar166._0_4_ = auVar96._0_4_ * auVar136._0_4_;
      auVar166._4_4_ = auVar96._4_4_ * auVar136._4_4_;
      auVar166._8_4_ = auVar96._8_4_ * auVar136._8_4_;
      auVar166._12_4_ = auVar96._12_4_ * auVar136._12_4_;
      auVar104._0_4_ = auVar136._0_4_ * auVar126._0_4_;
      auVar104._4_4_ = auVar136._4_4_ * auVar126._4_4_;
      auVar104._8_4_ = auVar136._8_4_ * auVar126._8_4_;
      auVar104._12_4_ = auVar136._12_4_ * auVar126._12_4_;
      auVar66 = vminps_avx(auVar166,auVar104);
      auVar136 = vmaxps_avx(auVar104,auVar166);
      auVar96 = vmovshdup_avx(auVar198);
      auVar76._0_4_ = auVar96._0_4_ * auVar65._0_4_;
      auVar76._4_4_ = auVar96._4_4_ * auVar65._4_4_;
      auVar76._8_4_ = auVar96._8_4_ * auVar65._8_4_;
      auVar76._12_4_ = auVar96._12_4_ * auVar65._12_4_;
      auVar167._0_4_ = auVar92._0_4_ * auVar96._0_4_;
      auVar167._4_4_ = auVar92._4_4_ * auVar96._4_4_;
      auVar167._8_4_ = auVar92._8_4_ * auVar96._8_4_;
      auVar167._12_4_ = auVar92._12_4_ * auVar96._12_4_;
      auVar96 = vminps_avx(auVar76,auVar167);
      auVar134._0_4_ = auVar66._0_4_ + auVar96._0_4_;
      auVar134._4_4_ = auVar66._4_4_ + auVar96._4_4_;
      auVar134._8_4_ = auVar66._8_4_ + auVar96._8_4_;
      auVar134._12_4_ = auVar66._12_4_ + auVar96._12_4_;
      auVar66 = vmaxps_avx(auVar167,auVar76);
      auVar77._0_4_ = auVar136._0_4_ + auVar66._0_4_;
      auVar77._4_4_ = auVar136._4_4_ + auVar66._4_4_;
      auVar77._8_4_ = auVar136._8_4_ + auVar66._8_4_;
      auVar77._12_4_ = auVar136._12_4_ + auVar66._12_4_;
      auVar136 = vsubps_avx(auVar203,auVar77);
      auVar66 = vsubps_avx(auVar203,auVar134);
      auVar135._0_4_ = fVar209 * auVar136._0_4_;
      auVar135._4_4_ = fVar210 * auVar136._4_4_;
      auVar135._8_4_ = fVar259 * auVar136._8_4_;
      auVar135._12_4_ = fVar260 * auVar136._12_4_;
      auVar168._0_4_ = fVar209 * auVar66._0_4_;
      auVar168._4_4_ = fVar210 * auVar66._4_4_;
      auVar168._8_4_ = fVar259 * auVar66._8_4_;
      auVar168._12_4_ = fVar260 * auVar66._12_4_;
      auVar78._0_4_ = fVar192 * auVar136._0_4_;
      auVar78._4_4_ = fVar153 * auVar136._4_4_;
      auVar78._8_4_ = fVar193 * auVar136._8_4_;
      auVar78._12_4_ = fVar208 * auVar136._12_4_;
      auVar105._0_4_ = fVar192 * auVar66._0_4_;
      auVar105._4_4_ = fVar153 * auVar66._4_4_;
      auVar105._8_4_ = fVar193 * auVar66._8_4_;
      auVar105._12_4_ = fVar208 * auVar66._12_4_;
      auVar136 = vminps_avx(auVar135,auVar168);
      auVar66 = vminps_avx(auVar78,auVar105);
      auVar136 = vminps_avx(auVar136,auVar66);
      auVar66 = vmaxps_avx(auVar168,auVar135);
      auVar96 = vmaxps_avx(auVar105,auVar78);
      auVar136 = vhaddps_avx(auVar136,auVar136);
      auVar66 = vmaxps_avx(auVar96,auVar66);
      auVar66 = vhaddps_avx(auVar66,auVar66);
      auVar96 = vmovshdup_avx(auVar117);
      auVar207 = ZEXT1664(auVar205);
      auVar126 = ZEXT416((uint)(auVar96._0_4_ + auVar136._0_4_));
      auVar136 = vmaxss_avx(auVar205,auVar126);
      auVar96 = ZEXT416((uint)(auVar96._0_4_ + auVar66._0_4_));
      auVar66 = vminss_avx(auVar96,auVar116);
      auVar228._8_4_ = 0x7fffffff;
      auVar228._0_8_ = 0x7fffffff7fffffff;
      auVar228._12_4_ = 0x7fffffff;
    } while (auVar66._0_4_ < auVar136._0_4_);
    uVar61 = 0;
    if ((fVar151 < fVar191) && (fVar152 < fVar142)) {
      auVar136 = vcmpps_avx(auVar96,auVar116,1);
      auVar66 = vcmpps_avx(auVar205,auVar126,1);
      auVar136 = vandps_avx(auVar66,auVar136);
      uVar61 = auVar136._0_4_;
    }
    if ((3 < uVar63 || fVar190 < 0.001) || (uVar61 & 1) != 0) {
      lVar58 = 200;
      do {
        fVar190 = auVar117._0_4_;
        fVar142 = 1.0 - fVar190;
        auVar136 = ZEXT416((uint)(fVar142 * fVar142 * fVar142));
        auVar136 = vshufps_avx(auVar136,auVar136,0);
        auVar66 = ZEXT416((uint)(fVar190 * 3.0 * fVar142 * fVar142));
        auVar66 = vshufps_avx(auVar66,auVar66,0);
        auVar96 = ZEXT416((uint)(fVar142 * fVar190 * fVar190 * 3.0));
        auVar96 = vshufps_avx(auVar96,auVar96,0);
        auVar126 = ZEXT416((uint)(fVar190 * fVar190 * fVar190));
        auVar126 = vshufps_avx(auVar126,auVar126,0);
        fVar142 = (float)local_640._0_4_ * auVar136._0_4_ +
                  (float)local_630._0_4_ * auVar66._0_4_ +
                  (float)local_4b0._0_4_ * auVar126._0_4_ + local_5a0 * auVar96._0_4_;
        fVar190 = (float)local_640._4_4_ * auVar136._4_4_ +
                  (float)local_630._4_4_ * auVar66._4_4_ +
                  (float)local_4b0._4_4_ * auVar126._4_4_ + fStack_59c * auVar96._4_4_;
        auVar79._0_8_ = CONCAT44(fVar190,fVar142);
        auVar79._8_4_ =
             fStack_638 * auVar136._8_4_ +
             fStack_628 * auVar66._8_4_ + fStack_4a8 * auVar126._8_4_ + fStack_598 * auVar96._8_4_;
        auVar79._12_4_ =
             fStack_634 * auVar136._12_4_ +
             fStack_624 * auVar66._12_4_ +
             fStack_4a4 * auVar126._12_4_ + fStack_594 * auVar96._12_4_;
        auVar106._8_8_ = auVar79._0_8_;
        auVar106._0_8_ = auVar79._0_8_;
        auVar66 = vshufpd_avx(auVar79,auVar79,1);
        auVar136 = vmovshdup_avx(auVar117);
        auVar66 = vsubps_avx(auVar66,auVar106);
        auVar80._0_4_ = auVar136._0_4_ * auVar66._0_4_ + fVar142;
        auVar80._4_4_ = auVar136._4_4_ * auVar66._4_4_ + fVar190;
        auVar80._8_4_ = auVar136._8_4_ * auVar66._8_4_ + fVar142;
        auVar80._12_4_ = auVar136._12_4_ * auVar66._12_4_ + fVar190;
        auVar136 = vshufps_avx(auVar80,auVar80,0);
        auVar66 = vshufps_avx(auVar80,auVar80,0x55);
        auVar107._0_4_ = auVar138._0_4_ * auVar136._0_4_ + auVar198._0_4_ * auVar66._0_4_;
        auVar107._4_4_ = auVar138._4_4_ * auVar136._4_4_ + auVar198._4_4_ * auVar66._4_4_;
        auVar107._8_4_ = auVar138._8_4_ * auVar136._8_4_ + auVar198._8_4_ * auVar66._8_4_;
        auVar107._12_4_ = auVar138._12_4_ * auVar136._12_4_ + auVar198._12_4_ * auVar66._12_4_;
        auVar117 = vsubps_avx(auVar117,auVar107);
        auVar136 = vandps_avx(auVar228,auVar80);
        auVar66 = vshufps_avx(auVar136,auVar136,0xf5);
        auVar136 = vmaxss_avx(auVar66,auVar136);
        if (auVar136._0_4_ < (float)local_4c0._0_4_) {
          fVar142 = auVar117._0_4_;
          if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
            auVar138 = vmovshdup_avx(auVar117);
            fVar190 = auVar138._0_4_;
            if ((0.0 <= fVar190) && (fVar190 <= 1.0)) {
              auVar138 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                       ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar92 = vinsertps_avx(auVar138,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar138 = vdpps_avx(auVar92,local_380,0x7f);
              auVar198 = vdpps_avx(auVar92,local_390,0x7f);
              auVar136 = vdpps_avx(auVar92,local_3c0,0x7f);
              auVar66 = vdpps_avx(auVar92,local_3d0,0x7f);
              auVar96 = vdpps_avx(auVar92,local_3e0,0x7f);
              auVar126 = vdpps_avx(auVar92,local_3f0,0x7f);
              fVar153 = 1.0 - fVar190;
              auVar65 = vdpps_avx(auVar92,local_3a0,0x7f);
              auVar92 = vdpps_avx(auVar92,local_3b0,0x7f);
              fVar193 = 1.0 - fVar142;
              fVar151 = auVar117._4_4_;
              fVar191 = auVar117._8_4_;
              fVar152 = auVar117._12_4_;
              fVar192 = fVar193 * fVar142 * fVar142 * 3.0;
              auVar187._0_4_ = fVar142 * fVar142 * fVar142;
              auVar187._4_4_ = fVar151 * fVar151 * fVar151;
              auVar187._8_4_ = fVar191 * fVar191 * fVar191;
              auVar187._12_4_ = fVar152 * fVar152 * fVar152;
              fVar151 = fVar142 * 3.0 * fVar193 * fVar193;
              fVar191 = fVar193 * fVar193 * fVar193;
              fVar142 = (fVar153 * auVar138._0_4_ + fVar190 * auVar136._0_4_) * fVar191 +
                        (fVar153 * auVar198._0_4_ + fVar190 * auVar66._0_4_) * fVar151 +
                        fVar192 * (fVar153 * auVar65._0_4_ + fVar190 * auVar96._0_4_) +
                        auVar187._0_4_ * (auVar126._0_4_ * fVar190 + fVar153 * auVar92._0_4_);
              if ((fVar172 <= fVar142) &&
                 (fVar190 = *(float *)(ray + k * 4 + 0x100), fVar142 <= fVar190)) {
                pGVar9 = (context->scene->geometries).items[uVar55].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_00e13838:
                  bVar56 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar56 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar117,auVar117,0x55);
                  auVar229._8_4_ = 0x3f800000;
                  auVar229._0_8_ = 0x3f8000003f800000;
                  auVar229._12_4_ = 0x3f800000;
                  auVar138 = vsubps_avx(auVar229,local_f0);
                  fVar152 = local_f0._0_4_;
                  fVar153 = local_f0._4_4_;
                  fVar208 = local_f0._8_4_;
                  fVar209 = local_f0._12_4_;
                  fVar210 = auVar138._0_4_;
                  fVar259 = auVar138._4_4_;
                  fVar260 = auVar138._8_4_;
                  fVar261 = auVar138._12_4_;
                  auVar243._0_4_ =
                       fVar152 * (float)local_4e0._0_4_ + fVar210 * (float)local_4d0._0_4_;
                  auVar243._4_4_ =
                       fVar153 * (float)local_4e0._4_4_ + fVar259 * (float)local_4d0._4_4_;
                  auVar243._8_4_ = fVar208 * fStack_4d8 + fVar260 * fStack_4c8;
                  auVar243._12_4_ = fVar209 * fStack_4d4 + fVar261 * fStack_4c4;
                  auVar256._0_4_ =
                       fVar152 * (float)local_530._0_4_ + fVar210 * (float)local_510._0_4_;
                  auVar256._4_4_ =
                       fVar153 * (float)local_530._4_4_ + fVar259 * (float)local_510._4_4_;
                  auVar256._8_4_ = fVar208 * fStack_528 + fVar260 * fStack_508;
                  auVar256._12_4_ = fVar209 * fStack_524 + fVar261 * fStack_504;
                  auVar268._0_4_ =
                       fVar152 * (float)local_420._0_4_ + fVar210 * (float)local_520._0_4_;
                  auVar268._4_4_ =
                       fVar153 * (float)local_420._4_4_ + fVar259 * (float)local_520._4_4_;
                  auVar268._8_4_ = fVar208 * fStack_418 + fVar260 * fStack_518;
                  auVar268._12_4_ = fVar209 * fStack_414 + fVar261 * fStack_514;
                  auVar230._0_4_ =
                       fVar152 * (float)local_500._0_4_ + fVar210 * (float)local_4f0._0_4_;
                  auVar230._4_4_ =
                       fVar153 * (float)local_500._4_4_ + fVar259 * (float)local_4f0._4_4_;
                  auVar230._8_4_ = fVar208 * fStack_4f8 + fVar260 * fStack_4e8;
                  auVar230._12_4_ = fVar209 * fStack_4f4 + fVar261 * fStack_4e4;
                  auVar66 = vsubps_avx(auVar256,auVar243);
                  auVar96 = vsubps_avx(auVar268,auVar256);
                  auVar126 = vsubps_avx(auVar230,auVar268);
                  local_110 = vshufps_avx(auVar117,auVar117,0);
                  fVar152 = local_110._0_4_;
                  fVar208 = local_110._4_4_;
                  fVar209 = local_110._8_4_;
                  fVar259 = local_110._12_4_;
                  auVar138 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                  fVar153 = auVar138._0_4_;
                  fVar193 = auVar138._4_4_;
                  fVar210 = auVar138._8_4_;
                  fVar260 = auVar138._12_4_;
                  auVar138 = vshufps_avx(auVar187,auVar187,0);
                  auVar198 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                  auVar136 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
                  auVar169._0_4_ =
                       ((auVar96._0_4_ * fVar153 + auVar126._0_4_ * fVar152) * fVar152 +
                       (auVar66._0_4_ * fVar153 + auVar96._0_4_ * fVar152) * fVar153) * 3.0;
                  auVar169._4_4_ =
                       ((auVar96._4_4_ * fVar193 + auVar126._4_4_ * fVar208) * fVar208 +
                       (auVar66._4_4_ * fVar193 + auVar96._4_4_ * fVar208) * fVar193) * 3.0;
                  auVar169._8_4_ =
                       ((auVar96._8_4_ * fVar210 + auVar126._8_4_ * fVar209) * fVar209 +
                       (auVar66._8_4_ * fVar210 + auVar96._8_4_ * fVar209) * fVar210) * 3.0;
                  auVar169._12_4_ =
                       ((auVar96._12_4_ * fVar260 + auVar126._12_4_ * fVar259) * fVar259 +
                       (auVar66._12_4_ * fVar260 + auVar96._12_4_ * fVar259) * fVar260) * 3.0;
                  auVar66 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
                  auVar108._0_4_ =
                       auVar66._0_4_ * (float)local_430._0_4_ +
                       auVar136._0_4_ * (float)local_440._0_4_ +
                       auVar138._0_4_ * (float)local_460._0_4_ +
                       auVar198._0_4_ * (float)local_450._0_4_;
                  auVar108._4_4_ =
                       auVar66._4_4_ * (float)local_430._4_4_ +
                       auVar136._4_4_ * (float)local_440._4_4_ +
                       auVar138._4_4_ * (float)local_460._4_4_ +
                       auVar198._4_4_ * (float)local_450._4_4_;
                  auVar108._8_4_ =
                       auVar66._8_4_ * fStack_428 +
                       auVar136._8_4_ * fStack_438 +
                       auVar138._8_4_ * fStack_458 + auVar198._8_4_ * fStack_448;
                  auVar108._12_4_ =
                       auVar66._12_4_ * fStack_424 +
                       auVar136._12_4_ * fStack_434 +
                       auVar138._12_4_ * fStack_454 + auVar198._12_4_ * fStack_444;
                  auVar138 = vshufps_avx(auVar169,auVar169,0xc9);
                  auVar137._0_4_ = auVar108._0_4_ * auVar138._0_4_;
                  auVar137._4_4_ = auVar108._4_4_ * auVar138._4_4_;
                  auVar137._8_4_ = auVar108._8_4_ * auVar138._8_4_;
                  auVar137._12_4_ = auVar108._12_4_ * auVar138._12_4_;
                  auVar138 = vshufps_avx(auVar108,auVar108,0xc9);
                  auVar109._0_4_ = auVar169._0_4_ * auVar138._0_4_;
                  auVar109._4_4_ = auVar169._4_4_ * auVar138._4_4_;
                  auVar109._8_4_ = auVar169._8_4_ * auVar138._8_4_;
                  auVar109._12_4_ = auVar169._12_4_ * auVar138._12_4_;
                  auVar138 = vsubps_avx(auVar109,auVar137);
                  local_170 = vshufps_avx(auVar138,auVar138,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar138,auVar138,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar138,auVar138,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_300._0_8_;
                  uStack_d8 = local_300._8_8_;
                  uStack_d0 = local_300._16_8_;
                  uStack_c8 = local_300._24_8_;
                  local_c0 = local_2e0._0_8_;
                  uStack_b8 = local_2e0._8_8_;
                  uStack_b0 = local_2e0._16_8_;
                  uStack_a8 = local_2e0._24_8_;
                  auVar82 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar142;
                  local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar60 & 0xf) << 4));
                  local_570 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar60 >> 4) * 0x10);
                  local_490.valid = (int *)local_580;
                  local_490.geometryUserPtr = pGVar9->userPtr;
                  local_490.context = context->user;
                  local_490.ray = (RTCRayN *)ray;
                  local_490.hit = local_180;
                  local_490.N = 8;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_490);
                  }
                  auVar138 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                  auVar198 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                  auVar141._16_16_ = auVar198;
                  auVar141._0_16_ = auVar138;
                  auVar19 = auVar82 & ~auVar141;
                  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0x7f,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0xbf,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar19[0x1f] < '\0') {
                    p_Var10 = context->args->filter;
                    if (p_Var10 == (RTCFilterFunctionN)0x0) {
                      auVar138 = SUB6416(ZEXT864(0),0) << 0x20;
                    }
                    else {
                      auVar138 = SUB6416(ZEXT864(0),0) << 0x20;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var10)(&local_490);
                        auVar138 = ZEXT816(0) << 0x40;
                      }
                    }
                    auVar198 = vpcmpeqd_avx(local_580,auVar138);
                    auVar138 = vpcmpeqd_avx(local_570,auVar138);
                    auVar88._16_16_ = auVar138;
                    auVar88._0_16_ = auVar198;
                    auVar114._8_4_ = 0xff800000;
                    auVar114._0_8_ = 0xff800000ff800000;
                    auVar114._12_4_ = 0xff800000;
                    auVar114._16_4_ = 0xff800000;
                    auVar114._20_4_ = 0xff800000;
                    auVar114._24_4_ = 0xff800000;
                    auVar114._28_4_ = 0xff800000;
                    auVar19 = vblendvps_avx(auVar114,*(undefined1 (*) [32])(local_490.ray + 0x100),
                                            auVar88);
                    *(undefined1 (*) [32])(local_490.ray + 0x100) = auVar19;
                    auVar82 = auVar82 & ~auVar88;
                    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar82 >> 0x7f,0) != '\0') ||
                          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar82 >> 0xbf,0) != '\0') ||
                        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar82[0x1f] < '\0') {
                      bVar56 = 1;
                      goto LAB_00e1383a;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar190;
                  goto LAB_00e13838;
                }
LAB_00e1383a:
                bVar64 = (bool)(bVar64 | bVar56);
              }
            }
          }
          break;
        }
        lVar58 = lVar58 + -1;
      } while (lVar58 != 0);
      goto LAB_00e12774;
    }
    auVar138 = vinsertps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar142),0x10);
    auVar289 = ZEXT1664(auVar138);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }